

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_avx::forward
          (InnerProduct_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  undefined4 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  _func_int *p_Var24;
  int *piVar25;
  long lVar26;
  void *pvVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  uint uVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  int p;
  int iVar42;
  float *pfVar43;
  uint uVar44;
  ulong uVar45;
  float *pfVar46;
  uint uVar47;
  void *pvVar48;
  long lVar49;
  long lVar50;
  float *pfVar51;
  ulong uVar52;
  ulong uVar53;
  float *pfVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  uint uVar58;
  uint uVar59;
  long lVar60;
  long lVar61;
  uint uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar89 [28];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar139 [32];
  float fVar148;
  float fVar175;
  float fVar176;
  v4sf one;
  undefined1 auVar162 [28];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar182;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar196 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar192 [16];
  undefined1 auVar206 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [16];
  undefined1 auVar232 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar247 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  float fVar267;
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar278 [32];
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar279 [64];
  Option opt_flatten;
  int local_164;
  uint local_148;
  float *local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  int local_120;
  Allocator *local_118;
  int local_110;
  int iStack_10c;
  undefined8 uStack_108;
  undefined4 uStack_100;
  size_t local_f8;
  undefined1 local_e8 [16];
  ulong local_d0;
  Mat *local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  InnerProduct_x86_avx *local_a8;
  long local_a0;
  long local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar287 [12];
  undefined1 auVar127 [32];
  undefined1 auVar133 [32];
  undefined1 auVar138 [32];
  undefined1 auVar140 [32];
  undefined1 auVar169 [32];
  undefined1 auVar197 [32];
  undefined1 auVar203 [32];
  
  if ((opt->use_int8_inference == true) &&
     (*(int *)(&this->field_0xdc + (long)this->_vptr_InnerProduct_x86_avx[-3]) != 0)) {
    iVar42 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar42;
  }
  iVar42 = cpu_support_x86_f16c();
  if ((iVar42 != 0) && (opt->use_fp16_storage == true)) {
    iVar42 = forward_fp16s(this,bottom_blob,top_blob,opt);
    return iVar42;
  }
  local_110 = bottom_blob->dims;
  if ((local_110 == 2) &&
     (bottom_blob->w ==
      *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_avx[-3]) /
      *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]))) {
    Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]),
                bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    p_Var24 = this->_vptr_InnerProduct_x86_avx[-3];
    innerproduct_gemm_sse
              (bottom_blob,top_blob,&this->weight_data_tm,
               (Mat *)(&this->field_0x178 + (long)p_Var24),
               *(int *)(&this->field_0xe0 + (long)p_Var24),
               (Mat *)(&this->field_0xe8 + (long)p_Var24),opt);
    return 0;
  }
  piVar25 = bottom_blob->refcount;
  local_138 = (float *)bottom_blob->data;
  uStack_130 = SUB84(bottom_blob->refcount,0);
  uStack_12c = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_128 = (undefined4)bottom_blob->elemsize;
  uStack_124 = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_120 = bottom_blob->elempack;
  local_118 = bottom_blob->allocator;
  uVar14 = bottom_blob->w;
  uVar15 = bottom_blob->h;
  uVar16 = bottom_blob->d;
  uVar17 = bottom_blob->c;
  auVar287._8_4_ = uVar17;
  auVar287._4_4_ = uVar16;
  auVar287._0_4_ = uVar15;
  uStack_108 = auVar287._0_8_;
  local_f8 = bottom_blob->cstep;
  if (piVar25 != (int *)0x0) {
    LOCK();
    *piVar25 = *piVar25 + 1;
    UNLOCK();
  }
  iStack_10c = uVar14;
  uStack_100 = uVar17;
  if (bottom_blob->dims != 1) {
    auVar90[0] = opt->lightmode;
    auVar90._1_3_ = *(undefined3 *)&opt->field_0x1;
    auVar90._4_4_ = opt->num_threads;
    auVar90._8_8_ = opt->blob_allocator;
    uVar18 = opt->workspace_allocator;
    uVar19 = opt->openmp_blocktime;
    uVar20 = opt->use_winograd_convolution;
    uVar21 = opt->use_sgemm_convolution;
    uVar22 = opt->use_int8_inference;
    uVar23 = opt->use_vulkan_compute;
    auVar90[0x1f] = uVar23;
    auVar90[0x1e] = uVar22;
    auVar90[0x1d] = uVar21;
    auVar90[0x1c] = uVar20;
    auVar90._24_4_ = uVar19;
    auVar90._16_8_ = uVar18;
    local_58._0_1_ = opt->use_bf16_storage;
    local_58._1_1_ = opt->use_fp16_packed;
    local_58._2_1_ = opt->use_fp16_storage;
    local_58._3_1_ = opt->use_fp16_arithmetic;
    local_58._4_1_ = opt->use_int8_packed;
    local_58._5_1_ = opt->use_int8_storage;
    local_58._6_1_ = opt->use_int8_arithmetic;
    local_58._7_1_ = opt->use_packing_layout;
    uStack_50._0_1_ = opt->use_shader_pack8;
    uStack_50._1_1_ = opt->use_subgroup_basic;
    uStack_50._2_1_ = opt->use_subgroup_vote;
    uStack_50._3_1_ = opt->use_subgroup_ballot;
    uStack_50._4_1_ = opt->use_subgroup_shuffle;
    uStack_50._5_1_ = opt->use_image_storage;
    uStack_50._6_1_ = opt->use_tensor_storage;
    uStack_50._7_1_ = opt->use_reserved_0;
    uStack_48._0_4_ = opt->flush_denormals;
    uStack_48._4_1_ = opt->use_local_pool_allocator;
    uStack_48._5_1_ = opt->use_shader_local_memory;
    uStack_48._6_1_ = opt->use_cooperative_matrix;
    uStack_48._7_1_ = opt->use_winograd23_convolution;
    uStack_40._0_1_ = opt->use_winograd43_convolution;
    uStack_40._1_1_ = opt->use_winograd63_convolution;
    uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
    uStack_40._3_1_ = opt->use_reserved_7;
    uStack_40._4_1_ = opt->use_reserved_8;
    uStack_40._5_1_ = opt->use_reserved_9;
    uStack_40._6_1_ = opt->use_reserved_10;
    uStack_40._7_1_ = opt->use_reserved_11;
    local_78 = auVar90._0_8_;
    pAStack_70 = opt->workspace_allocator;
    auStack_68 = auVar90._16_16_;
    in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
    in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
    in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_138);
  }
  uVar44 = 1;
  if (opt->use_packing_layout == true) {
    uVar44 = 8;
    if ((*(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]) & 7) != 0) {
      uVar44 = (uint)((*(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]) & 3
                      ) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]) /
                       (int)uVar44,
              (ulong)uVar44 * (CONCAT44(uStack_124,local_128) / (ulong)(long)local_120),uVar44,
              opt->blob_allocator);
  pfVar54 = local_138;
  local_164 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_0030080e;
  p_Var24 = this->_vptr_InnerProduct_x86_avx[-3];
  uVar44 = *(uint *)(&this->field_0xe0 + (long)p_Var24);
  uVar62 = local_120 * iStack_10c;
  iVar42 = top_blob->elempack;
  uVar47 = top_blob->w;
  lVar26 = *(long *)(&this->field_0x178 + (long)p_Var24);
  local_164 = 0;
  if (iVar42 != 1) {
    if (iVar42 == 4) {
      if (0 < (int)uVar47) {
        uVar45 = 0;
        auVar99 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar237 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar226 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        do {
          fVar267 = 0.0;
          fVar270 = 0.0;
          fVar271 = 0.0;
          fVar272 = 0.0;
          if (lVar26 != 0) {
            pfVar54 = (float *)(lVar26 + uVar45 * 0x10);
            fVar267 = *pfVar54;
            fVar270 = pfVar54[1];
            fVar271 = pfVar54[2];
            fVar272 = pfVar54[3];
          }
          pfVar54 = (float *)((long)(this->weight_data_tm).w * uVar45 *
                              (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          pfVar51 = local_138;
          if ((int)uVar62 < 8) {
            fVar281 = 0.0;
            fVar282 = 0.0;
            fVar283 = 0.0;
            fVar284 = 0.0;
            fVar285 = 0.0;
            fVar286 = 0.0;
            fVar148 = 0.0;
            fVar143 = 0.0;
            fVar144 = 0.0;
            fVar145 = 0.0;
            fVar146 = 0.0;
            fVar147 = 0.0;
            fVar277 = 0.0;
            fVar280 = 0.0;
            fVar273 = 0.0;
            fVar274 = 0.0;
            fVar275 = 0.0;
            fVar276 = 0.0;
            fVar100 = 0.0;
            fVar141 = 0.0;
            fVar142 = 0.0;
            auVar245 = ZEXT864(0);
            uVar59 = 0;
          }
          else {
            auVar245 = ZEXT864(0);
            iVar42 = 7;
            fVar273 = 0.0;
            fVar274 = 0.0;
            fVar275 = 0.0;
            fVar276 = 0.0;
            fVar100 = 0.0;
            fVar141 = 0.0;
            fVar142 = 0.0;
            fVar143 = 0.0;
            fVar144 = 0.0;
            fVar145 = 0.0;
            fVar146 = 0.0;
            fVar147 = 0.0;
            fVar277 = 0.0;
            fVar280 = 0.0;
            fVar281 = 0.0;
            fVar282 = 0.0;
            fVar283 = 0.0;
            fVar284 = 0.0;
            fVar285 = 0.0;
            fVar286 = 0.0;
            fVar148 = 0.0;
            do {
              fVar175 = *pfVar51;
              fVar176 = pfVar51[1];
              fVar177 = pfVar51[2];
              fVar178 = pfVar51[3];
              fVar179 = pfVar51[4];
              fVar180 = pfVar51[6];
              auVar245 = ZEXT3264(CONCAT428(fVar176 + auVar245._28_4_,
                                            CONCAT424(fVar176 * pfVar54[6] + auVar245._24_4_,
                                                      CONCAT420(fVar176 * pfVar54[5] +
                                                                auVar245._20_4_,
                                                                CONCAT416(fVar176 * pfVar54[4] +
                                                                          auVar245._16_4_,
                                                                          CONCAT412(fVar175 * 
                                                  pfVar54[3] + auVar245._12_4_,
                                                  CONCAT48(fVar175 * pfVar54[2] + auVar245._8_4_,
                                                           CONCAT44(fVar175 * pfVar54[1] +
                                                                    auVar245._4_4_,
                                                                    fVar175 * *pfVar54 +
                                                                    auVar245._0_4_))))))));
              fVar273 = fVar273 + fVar177 * pfVar54[8];
              fVar274 = fVar274 + fVar177 * pfVar54[9];
              fVar275 = fVar275 + fVar177 * pfVar54[10];
              fVar276 = fVar276 + fVar177 * pfVar54[0xb];
              fVar100 = fVar100 + fVar178 * pfVar54[0xc];
              fVar141 = fVar141 + fVar178 * pfVar54[0xe];
              fVar142 = fVar142 + fVar178;
              fVar143 = fVar179 * pfVar54[0x10] + fVar143;
              fVar144 = fVar179 * pfVar54[0x11] + fVar144;
              fVar145 = fVar179 * pfVar54[0x12] + fVar145;
              fVar146 = fVar179 * pfVar54[0x13] + fVar146;
              fVar147 = pfVar51[5] * pfVar54[0x14] + fVar147;
              fVar277 = pfVar51[5] * pfVar54[0x16] + fVar277;
              fVar280 = fVar176 + fVar280;
              fVar281 = fVar281 + fVar180 * pfVar54[0x18];
              fVar282 = fVar282 + fVar180 * pfVar54[0x19];
              fVar283 = fVar283 + fVar180 * pfVar54[0x1a];
              fVar284 = fVar284 + fVar180 * pfVar54[0x1b];
              fVar285 = fVar285 + pfVar51[7] * pfVar54[0x1c];
              fVar286 = fVar286 + pfVar51[7] * pfVar54[0x1e];
              fVar148 = fVar148 + fVar176;
              pfVar51 = pfVar51 + 8;
              pfVar54 = pfVar54 + 0x20;
              iVar42 = iVar42 + 8;
              uVar59 = uVar62 & 0xfffffff8;
            } while (iVar42 < (int)uVar62);
          }
          uVar58 = uVar59 | 3;
          while( true ) {
            if ((int)uVar62 <= (int)uVar58) break;
            fVar175 = *pfVar51;
            fVar176 = pfVar51[1];
            fVar177 = pfVar51[2];
            fVar178 = pfVar51[3];
            auVar245 = ZEXT3264(CONCAT428(fVar176 + auVar245._28_4_,
                                          CONCAT424(fVar176 * pfVar54[6] + auVar245._24_4_,
                                                    CONCAT420(fVar176 * pfVar54[5] + auVar245._20_4_
                                                              ,CONCAT416(fVar176 * pfVar54[4] +
                                                                         auVar245._16_4_,
                                                                         CONCAT412(fVar175 * pfVar54
                                                  [3] + auVar245._12_4_,
                                                  CONCAT48(fVar175 * pfVar54[2] + auVar245._8_4_,
                                                           CONCAT44(fVar175 * pfVar54[1] +
                                                                    auVar245._4_4_,
                                                                    fVar175 * *pfVar54 +
                                                                    auVar245._0_4_))))))));
            fVar273 = fVar273 + fVar177 * pfVar54[8];
            fVar274 = fVar274 + fVar177 * pfVar54[9];
            fVar275 = fVar275 + fVar177 * pfVar54[10];
            fVar276 = fVar276 + fVar177 * pfVar54[0xb];
            fVar100 = fVar100 + fVar178 * pfVar54[0xc];
            fVar141 = fVar141 + fVar178 * pfVar54[0xe];
            fVar142 = fVar142 + fVar178;
            pfVar51 = pfVar51 + 4;
            pfVar54 = pfVar54 + 0x10;
            uVar58 = uVar59 + 7;
            uVar59 = uVar59 + 4;
          }
          if (uVar62 - uVar59 != 0 && (int)uVar59 <= (int)uVar62) {
            lVar56 = 0;
            do {
              fVar175 = pfVar51[lVar56];
              fVar267 = fVar175 * *pfVar54 + fVar267;
              fVar270 = fVar175 * pfVar54[1] + fVar270;
              fVar271 = fVar175 * pfVar54[2] + fVar271;
              fVar272 = fVar175 * pfVar54[3] + fVar272;
              pfVar54 = pfVar54 + 4;
              lVar56 = lVar56 + 1;
            } while (uVar62 - uVar59 != (int)lVar56);
          }
          fVar274 = fVar282 + fVar144 + fVar274 + auVar245._4_4_;
          auVar184._0_4_ =
               fVar285 + fVar147 + fVar100 + auVar245._16_4_ +
               fVar281 + fVar143 + fVar273 + auVar245._0_4_ + fVar267;
          auVar184._4_4_ = fVar274 + fVar274 + fVar270;
          auVar184._8_4_ =
               fVar286 + fVar277 + fVar141 + auVar245._24_4_ +
               fVar283 + fVar145 + fVar275 + auVar245._8_4_ + fVar271;
          auVar184._12_4_ =
               fVar148 + fVar280 + fVar142 + auVar245._28_4_ +
               fVar284 + fVar146 + fVar276 + auVar245._12_4_ + fVar272;
          auVar227 = auVar99._0_16_;
          fVar273 = auVar237._0_4_;
          fVar274 = auVar237._4_4_;
          fVar275 = auVar237._8_4_;
          fVar276 = auVar237._12_4_;
          auVar261 = auVar226._0_16_;
          fVar267 = auVar226._0_4_;
          fVar270 = auVar226._4_4_;
          fVar271 = auVar226._8_4_;
          fVar272 = auVar226._12_4_;
          switch(uVar44) {
          case 1:
            auVar184 = vmaxps_avx(auVar184,auVar227);
            break;
          case 2:
            auVar261 = vmaxps_avx(auVar184,auVar227);
            auVar227 = vminps_avx(auVar184,auVar227);
            fVar267 = **(float **)(&this->field_0xe8 + (long)p_Var24);
            auVar184._0_4_ = fVar267 * auVar227._0_4_ + auVar261._0_4_;
            auVar184._4_4_ = fVar267 * auVar227._4_4_ + auVar261._4_4_;
            auVar184._8_4_ = fVar267 * auVar227._8_4_ + auVar261._8_4_;
            auVar184._12_4_ = fVar267 * auVar227._12_4_ + auVar261._12_4_;
            break;
          case 3:
            uVar13 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var24);
            auVar103._4_4_ = uVar13;
            auVar103._0_4_ = uVar13;
            auVar103._8_4_ = uVar13;
            auVar103._12_4_ = uVar13;
            uVar13 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var24))[1];
            auVar157._4_4_ = uVar13;
            auVar157._0_4_ = uVar13;
            auVar157._8_4_ = uVar13;
            auVar157._12_4_ = uVar13;
            auVar184 = vmaxps_avx(auVar184,auVar103);
            auVar184 = vminps_avx(auVar184,auVar157);
            break;
          case 4:
            uVar52 = CONCAT44(auVar184._4_4_,auVar184._0_4_);
            auVar72._0_8_ = uVar52 ^ 0x8000000080000000;
            auVar72._8_4_ = -auVar184._8_4_;
            auVar72._12_4_ = -auVar184._12_4_;
            auVar104._8_4_ = 0x42b0c0a5;
            auVar104._0_8_ = 0x42b0c0a542b0c0a5;
            auVar104._12_4_ = 0x42b0c0a5;
            auVar184 = vminps_avx(auVar72,auVar104);
            auVar105._8_4_ = 0xc2b0c0a5;
            auVar105._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar105._12_4_ = 0xc2b0c0a5;
            auVar188 = vmaxps_avx(auVar184,auVar105);
            auVar106._0_4_ = fVar273 + auVar188._0_4_ * 1.442695;
            auVar106._4_4_ = fVar274 + auVar188._4_4_ * 1.442695;
            auVar106._8_4_ = fVar275 + auVar188._8_4_ * 1.442695;
            auVar106._12_4_ = fVar276 + auVar188._12_4_ * 1.442695;
            auVar158._0_4_ = (int)auVar106._0_4_;
            auVar158._4_4_ = (int)auVar106._4_4_;
            auVar158._8_4_ = (int)auVar106._8_4_;
            auVar158._12_4_ = (int)auVar106._12_4_;
            auVar227 = vcvtdq2ps_avx(auVar158);
            auVar184 = vcmpps_avx(auVar106,auVar227,1);
            auVar184 = vandps_avx(auVar184,auVar261);
            auVar184 = vsubps_avx(auVar227,auVar184);
            fVar100 = auVar188._0_4_ + auVar184._0_4_ * -0.6931472;
            fVar141 = auVar188._4_4_ + auVar184._4_4_ * -0.6931472;
            fVar142 = auVar188._8_4_ + auVar184._8_4_ * -0.6931472;
            fVar143 = auVar188._12_4_ + auVar184._12_4_ * -0.6931472;
            auVar107._0_4_ = (int)auVar184._0_4_;
            auVar107._4_4_ = (int)auVar184._4_4_;
            auVar107._8_4_ = (int)auVar184._8_4_;
            auVar107._12_4_ = (int)auVar184._12_4_;
            auVar184 = vpslld_avx(auVar107,0x17);
            auVar184 = vpaddd_avx(auVar184,auVar261);
            auVar73._0_4_ =
                 (fVar100 + fVar267 +
                 fVar100 * fVar100 *
                 (fVar273 +
                 ((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) * fVar100 +
                  0.041665796) * fVar100 + 0.16666666) * fVar100)) * auVar184._0_4_ + fVar267;
            auVar73._4_4_ =
                 (fVar141 + fVar270 +
                 fVar141 * fVar141 *
                 (fVar274 +
                 ((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                  0.041665796) * fVar141 + 0.16666666) * fVar141)) * auVar184._4_4_ + fVar270;
            auVar73._8_4_ =
                 (fVar142 + fVar271 +
                 fVar142 * fVar142 *
                 (fVar275 +
                 ((((fVar142 * 0.00019875691 + 0.0013981999) * fVar142 + 0.008333452) * fVar142 +
                  0.041665796) * fVar142 + 0.16666666) * fVar142)) * auVar184._8_4_ + fVar271;
            auVar73._12_4_ =
                 (fVar143 + fVar272 +
                 fVar143 * fVar143 *
                 (fVar276 +
                 ((((fVar143 * 0.00019875691 + 0.0013981999) * fVar143 + 0.008333452) * fVar143 +
                  0.041665796) * fVar143 + 0.16666666) * fVar143)) * auVar184._12_4_ + fVar272;
            auVar184 = vrcpps_avx(auVar73);
            fVar267 = auVar184._0_4_;
            auVar74._0_4_ = auVar73._0_4_ * fVar267;
            fVar270 = auVar184._4_4_;
            auVar74._4_4_ = auVar73._4_4_ * fVar270;
            fVar271 = auVar184._8_4_;
            auVar74._8_4_ = auVar73._8_4_ * fVar271;
            fVar272 = auVar184._12_4_;
            auVar74._12_4_ = auVar73._12_4_ * fVar272;
            auVar227 = vsubps_avx(auVar261,auVar74);
            auVar184._0_4_ = fVar267 + fVar267 * auVar227._0_4_;
            auVar184._4_4_ = fVar270 + fVar270 * auVar227._4_4_;
            auVar184._8_4_ = fVar271 + fVar271 * auVar227._8_4_;
            auVar184._12_4_ = fVar272 + fVar272 * auVar227._12_4_;
            break;
          case 5:
            auVar247._8_4_ = 0x42b0c0a5;
            auVar247._0_8_ = 0x42b0c0a542b0c0a5;
            auVar247._12_4_ = 0x42b0c0a5;
            auVar227 = vminps_avx(auVar247,auVar184);
            auVar253._8_4_ = 0xc2b0c0a5;
            auVar253._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar253._12_4_ = 0xc2b0c0a5;
            auVar102 = vmaxps_avx(auVar253,auVar227);
            auVar150._0_4_ = fVar273 + auVar102._0_4_ * 1.442695;
            auVar150._4_4_ = fVar274 + auVar102._4_4_ * 1.442695;
            auVar150._8_4_ = fVar275 + auVar102._8_4_ * 1.442695;
            auVar150._12_4_ = fVar276 + auVar102._12_4_ * 1.442695;
            auVar186._0_4_ = (int)auVar150._0_4_;
            auVar186._4_4_ = (int)auVar150._4_4_;
            auVar186._8_4_ = (int)auVar150._8_4_;
            auVar186._12_4_ = (int)auVar150._12_4_;
            auVar188 = vcvtdq2ps_avx(auVar186);
            auVar227 = vcmpps_avx(auVar150,auVar188,1);
            auVar227 = vandps_avx(auVar227,auVar261);
            auVar227 = vsubps_avx(auVar188,auVar227);
            auVar187._0_4_ = auVar227._0_4_ * 0.6931472;
            auVar187._4_4_ = auVar227._4_4_ * 0.6931472;
            auVar187._8_4_ = auVar227._8_4_ * 0.6931472;
            auVar187._12_4_ = auVar227._12_4_ * 0.6931472;
            auVar188 = vsubps_avx(auVar102,auVar187);
            fVar100 = auVar188._0_4_;
            fVar141 = auVar188._4_4_;
            fVar142 = auVar188._8_4_;
            fVar143 = auVar188._12_4_;
            auVar151._0_4_ = (int)auVar227._0_4_;
            auVar151._4_4_ = (int)auVar227._4_4_;
            auVar151._8_4_ = (int)auVar227._8_4_;
            auVar151._12_4_ = (int)auVar227._12_4_;
            auVar227 = vpslld_avx(auVar151,0x17);
            auVar227 = vpaddd_avx(auVar227,auVar261);
            auVar101._0_4_ =
                 (fVar100 + fVar267 +
                 fVar100 * fVar100 *
                 (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) * fVar100 +
                   0.041665796) * fVar100 + 0.16666666) * fVar100 + fVar273)) * auVar227._0_4_ +
                 fVar267;
            auVar101._4_4_ =
                 (fVar141 + fVar270 +
                 fVar141 * fVar141 *
                 (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                   0.041665796) * fVar141 + 0.16666666) * fVar141 + fVar274)) * auVar227._4_4_ +
                 fVar270;
            auVar101._8_4_ =
                 (fVar142 + fVar271 +
                 fVar142 * fVar142 *
                 (((((fVar142 * 0.00019875691 + 0.0013981999) * fVar142 + 0.008333452) * fVar142 +
                   0.041665796) * fVar142 + 0.16666666) * fVar142 + fVar275)) * auVar227._8_4_ +
                 fVar271;
            auVar101._12_4_ =
                 (fVar143 + fVar272 +
                 fVar143 * fVar143 *
                 (((((fVar143 * 0.00019875691 + 0.0013981999) * fVar143 + 0.008333452) * fVar143 +
                   0.041665796) * fVar143 + 0.16666666) * fVar143 + fVar276)) * auVar227._12_4_ +
                 fVar272;
            auVar152._8_4_ = 0x800000;
            auVar152._0_8_ = 0x80000000800000;
            auVar152._12_4_ = 0x800000;
            auVar227 = vmaxps_avx(auVar101,auVar152);
            auVar188 = vpsrld_avx(auVar227,0x17);
            auVar228._8_4_ = 0xffffff82;
            auVar228._0_8_ = 0xffffff82ffffff82;
            auVar228._12_4_ = 0xffffff82;
            auVar188 = vpaddd_avx(auVar188,auVar228);
            auVar229._8_4_ = 0x807fffff;
            auVar229._0_8_ = 0x807fffff807fffff;
            auVar229._12_4_ = 0x807fffff;
            auVar227 = vandps_avx(auVar227,auVar229);
            auVar150 = vorps_avx(auVar227,auVar237._0_16_);
            auVar102 = vcvtdq2ps_avx(auVar188);
            auVar230._8_4_ = 0x3f3504f3;
            auVar230._0_8_ = 0x3f3504f33f3504f3;
            auVar230._12_4_ = 0x3f3504f3;
            auVar188 = vcmpps_avx(auVar150,auVar230,1);
            auVar227 = vandps_avx(auVar188,auVar150);
            fVar100 = auVar227._0_4_ + auVar150._0_4_ + -1.0;
            fVar141 = auVar227._4_4_ + auVar150._4_4_ + -1.0;
            fVar142 = auVar227._8_4_ + auVar150._8_4_ + -1.0;
            fVar143 = auVar227._12_4_ + auVar150._12_4_ + -1.0;
            auVar227 = vandps_avx(auVar188,auVar261);
            auVar188 = vsubps_avx(auVar102,auVar227);
            auVar227 = vcmpps_avx(auVar101,_DAT_005930d0,2);
            auVar237 = ZEXT1664(auVar237._0_16_);
            auVar153._0_4_ =
                 (auVar188._0_4_ * 0.6931472 + fVar100 +
                 (((((((((fVar100 * 0.070376836 + -0.1151461) * fVar100 + 0.116769984) * fVar100 +
                       -0.12420141) * fVar100 + 0.14249323) * fVar100 + -0.16668057) * fVar100 +
                    0.20000714) * fVar100 + -0.24999994) * fVar100 + 0.3333333) * fVar100 + -0.5) *
                 fVar100 * fVar100) * -2.0;
            auVar153._4_4_ =
                 (auVar188._4_4_ * 0.6931472 + fVar141 +
                 (((((((((fVar141 * 0.070376836 + -0.1151461) * fVar141 + 0.116769984) * fVar141 +
                       -0.12420141) * fVar141 + 0.14249323) * fVar141 + -0.16668057) * fVar141 +
                    0.20000714) * fVar141 + -0.24999994) * fVar141 + 0.3333333) * fVar141 + -0.5) *
                 fVar141 * fVar141) * -2.0;
            auVar153._8_4_ =
                 (auVar188._8_4_ * 0.6931472 + fVar142 +
                 (((((((((fVar142 * 0.070376836 + -0.1151461) * fVar142 + 0.116769984) * fVar142 +
                       -0.12420141) * fVar142 + 0.14249323) * fVar142 + -0.16668057) * fVar142 +
                    0.20000714) * fVar142 + -0.24999994) * fVar142 + 0.3333333) * fVar142 + -0.5) *
                 fVar142 * fVar142) * -2.0;
            auVar153._12_4_ =
                 (auVar188._12_4_ * 0.6931472 + fVar143 +
                 (((((((((fVar143 * 0.070376836 + -0.1151461) * fVar143 + 0.116769984) * fVar143 +
                       -0.12420141) * fVar143 + 0.14249323) * fVar143 + -0.16668057) * fVar143 +
                    0.20000714) * fVar143 + -0.24999994) * fVar143 + 0.3333333) * fVar143 + -0.5) *
                 fVar143 * fVar143) * -2.0;
            auVar189._8_4_ = 0x7fffffff;
            auVar189._0_8_ = 0x7fffffff7fffffff;
            auVar189._12_4_ = 0x7fffffff;
            auVar227 = vblendvps_avx(auVar153,auVar189,auVar227);
            auVar154._8_4_ = 0x42b0c0a5;
            auVar154._0_8_ = 0x42b0c0a542b0c0a5;
            auVar154._12_4_ = 0x42b0c0a5;
            auVar227 = vminps_avx(auVar227,auVar154);
            auVar102 = vmaxps_avx(auVar253,auVar227);
            auVar155._0_4_ = auVar102._0_4_ * 1.442695 + fVar273;
            auVar155._4_4_ = auVar102._4_4_ * 1.442695 + fVar274;
            auVar155._8_4_ = auVar102._8_4_ * 1.442695 + fVar275;
            auVar155._12_4_ = auVar102._12_4_ * 1.442695 + fVar276;
            auVar190._0_4_ = (int)auVar155._0_4_;
            auVar190._4_4_ = (int)auVar155._4_4_;
            auVar190._8_4_ = (int)auVar155._8_4_;
            auVar190._12_4_ = (int)auVar155._12_4_;
            auVar188 = vcvtdq2ps_avx(auVar190);
            auVar227 = vcmpps_avx(auVar155,auVar188,1);
            auVar227 = vandps_avx(auVar227,auVar261);
            auVar227 = vsubps_avx(auVar188,auVar227);
            auVar191._0_4_ = auVar227._0_4_ * 0.6931472;
            auVar191._4_4_ = auVar227._4_4_ * 0.6931472;
            auVar191._8_4_ = auVar227._8_4_ * 0.6931472;
            auVar191._12_4_ = auVar227._12_4_ * 0.6931472;
            auVar226 = ZEXT1664(auVar261);
            auVar188 = vsubps_avx(auVar102,auVar191);
            fVar100 = auVar188._0_4_;
            fVar141 = auVar188._4_4_;
            fVar142 = auVar188._8_4_;
            fVar143 = auVar188._12_4_;
            auVar99 = ZEXT864(0) << 0x20;
            auVar156._0_4_ = (int)auVar227._0_4_;
            auVar156._4_4_ = (int)auVar227._4_4_;
            auVar156._8_4_ = (int)auVar227._8_4_;
            auVar156._12_4_ = (int)auVar227._12_4_;
            auVar227 = vpslld_avx(auVar156,0x17);
            auVar227 = vpaddd_avx(auVar227,auVar261);
            auVar261._0_4_ =
                 (fVar100 + fVar267 +
                 fVar100 * fVar100 *
                 (fVar273 +
                 ((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) * fVar100 +
                  0.041665796) * fVar100 + 0.16666666) * fVar100)) * auVar227._0_4_ + fVar267;
            auVar261._4_4_ =
                 (fVar141 + fVar270 +
                 fVar141 * fVar141 *
                 (fVar274 +
                 ((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                  0.041665796) * fVar141 + 0.16666666) * fVar141)) * auVar227._4_4_ + fVar270;
            auVar261._8_4_ =
                 (fVar142 + fVar271 +
                 fVar142 * fVar142 *
                 (fVar275 +
                 ((((fVar142 * 0.00019875691 + 0.0013981999) * fVar142 + 0.008333452) * fVar142 +
                  0.041665796) * fVar142 + 0.16666666) * fVar142)) * auVar227._8_4_ + fVar271;
            auVar261._12_4_ =
                 (fVar143 + fVar272 +
                 fVar143 * fVar143 *
                 (fVar276 +
                 ((((fVar143 * 0.00019875691 + 0.0013981999) * fVar143 + 0.008333452) * fVar143 +
                  0.041665796) * fVar143 + 0.16666666) * fVar143)) * auVar227._12_4_ + fVar272;
            auVar227 = vrcpps_avx(auVar261);
            fVar267 = auVar227._0_4_;
            fVar270 = auVar227._4_4_;
            fVar271 = auVar227._8_4_;
            fVar272 = auVar227._12_4_;
            auVar102._0_4_ = auVar261._0_4_ * (fVar267 + fVar267);
            auVar102._4_4_ = auVar261._4_4_ * (fVar270 + fVar270);
            auVar102._8_4_ = auVar261._8_4_ * (fVar271 + fVar271);
            auVar102._12_4_ = auVar261._12_4_ * (fVar272 + fVar272);
            auVar231._8_4_ = 0x40000000;
            auVar231._0_8_ = 0x4000000040000000;
            auVar231._12_4_ = 0x40000000;
            auVar261 = vsubps_avx(auVar231,auVar102);
            auVar227._0_4_ = fVar267 + fVar267 + -1.0 + fVar267 * auVar261._0_4_;
            auVar227._4_4_ = fVar270 + fVar270 + -1.0 + fVar270 * auVar261._4_4_;
            auVar227._8_4_ = fVar271 + fVar271 + -1.0 + fVar271 * auVar261._8_4_;
            auVar227._12_4_ = fVar272 + fVar272 + -1.0 + fVar272 * auVar261._12_4_;
            goto LAB_002ff453;
          case 6:
            fVar267 = **(float **)(&this->field_0xe8 + (long)p_Var24);
            fVar270 = (*(float **)(&this->field_0xe8 + (long)p_Var24))[1];
            auVar188._0_4_ = fVar267 * auVar184._0_4_ + fVar270;
            auVar188._4_4_ = fVar267 * auVar184._4_4_ + fVar270;
            auVar188._8_4_ = fVar267 * auVar184._8_4_ + fVar270;
            auVar188._12_4_ = fVar267 * auVar184._12_4_ + fVar270;
            auVar227 = vmaxps_avx(auVar188,auVar227);
            auVar227 = vminps_avx(auVar227,auVar261);
LAB_002ff453:
            auVar184._0_4_ = auVar227._0_4_ * auVar184._0_4_;
            auVar184._4_4_ = auVar227._4_4_ * auVar184._4_4_;
            auVar184._8_4_ = auVar227._8_4_ * auVar184._8_4_;
            auVar184._12_4_ = auVar227._12_4_ * auVar184._12_4_;
          }
          *(undefined1 (*) [16])((long)top_blob->data + uVar45 * 0x10) = auVar184;
          uVar45 = uVar45 + 1;
        } while (uVar45 != uVar47);
      }
    }
    else if ((iVar42 == 8) && (0 < (int)uVar47)) {
      uVar45 = 0;
      auVar226 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar99 = ZEXT3264(CONCAT428(0x3f800000,
                                   CONCAT424(0x3f800000,
                                             CONCAT420(0x3f800000,
                                                       CONCAT416(0x3f800000,
                                                                 CONCAT412(0x3f800000,
                                                                           CONCAT48(0x3f800000,
                                                                                                                                                                        
                                                  0x3f8000003f800000)))))));
      do {
        fVar271 = 0.0;
        fVar272 = 0.0;
        fVar267 = 0.0;
        fVar270 = 0.0;
        fVar273 = 0.0;
        fVar274 = 0.0;
        fVar275 = 0.0;
        fVar276 = 0.0;
        if (lVar26 != 0) {
          pfVar54 = (float *)(lVar26 + uVar45 * 0x20);
          fVar267 = *pfVar54;
          fVar270 = pfVar54[1];
          fVar271 = pfVar54[2];
          fVar272 = pfVar54[3];
          fVar273 = pfVar54[4];
          fVar274 = pfVar54[5];
          fVar275 = pfVar54[6];
          fVar276 = pfVar54[7];
        }
        pfVar54 = (float *)((long)(this->weight_data_tm).w * uVar45 *
                            (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
        pfVar51 = local_138;
        if ((int)uVar62 < 8) {
          fVar148 = 0.0;
          fVar175 = 0.0;
          fVar176 = 0.0;
          fVar177 = 0.0;
          fVar178 = 0.0;
          fVar179 = 0.0;
          fVar180 = 0.0;
          fVar181 = 0.0;
          auVar248 = SUB6432(ZEXT864(0),0);
          fVar182 = 0.0;
          fVar207 = 0.0;
          fVar208 = 0.0;
          fVar209 = 0.0;
          fVar210 = 0.0;
          fVar211 = 0.0;
          fVar212 = 0.0;
          fVar213 = 0.0;
          auVar243 = SUB6432(ZEXT864(0),0);
          fVar277 = 0.0;
          fVar280 = 0.0;
          fVar281 = 0.0;
          fVar282 = 0.0;
          fVar283 = 0.0;
          fVar284 = 0.0;
          fVar285 = 0.0;
          fVar286 = 0.0;
          fVar100 = 0.0;
          fVar141 = 0.0;
          fVar142 = 0.0;
          fVar143 = 0.0;
          fVar144 = 0.0;
          fVar145 = 0.0;
          fVar146 = 0.0;
          fVar147 = 0.0;
          auVar237 = ZEXT864(0);
          uVar59 = 0;
        }
        else {
          auVar237 = ZEXT864(0);
          iVar42 = 7;
          fVar100 = 0.0;
          fVar141 = 0.0;
          fVar142 = 0.0;
          fVar143 = 0.0;
          fVar144 = 0.0;
          fVar145 = 0.0;
          fVar146 = 0.0;
          fVar147 = 0.0;
          fVar277 = 0.0;
          fVar280 = 0.0;
          fVar281 = 0.0;
          fVar282 = 0.0;
          fVar283 = 0.0;
          fVar284 = 0.0;
          fVar285 = 0.0;
          fVar286 = 0.0;
          auVar245 = ZEXT864(0);
          fVar182 = 0.0;
          fVar207 = 0.0;
          fVar208 = 0.0;
          fVar209 = 0.0;
          fVar210 = 0.0;
          fVar211 = 0.0;
          fVar212 = 0.0;
          fVar213 = 0.0;
          auVar251 = ZEXT864(0);
          fVar148 = 0.0;
          fVar175 = 0.0;
          fVar176 = 0.0;
          fVar177 = 0.0;
          fVar178 = 0.0;
          fVar179 = 0.0;
          fVar180 = 0.0;
          fVar181 = 0.0;
          do {
            fVar9 = *pfVar51;
            fVar10 = pfVar51[1];
            fVar11 = pfVar51[2];
            fVar12 = pfVar51[3];
            fVar267 = fVar9 * *pfVar54 + fVar267;
            fVar270 = fVar9 * pfVar54[1] + fVar270;
            fVar271 = fVar9 * pfVar54[2] + fVar271;
            fVar272 = fVar9 * pfVar54[3] + fVar272;
            fVar273 = fVar9 * pfVar54[4] + fVar273;
            fVar274 = fVar9 * pfVar54[5] + fVar274;
            fVar275 = fVar9 * pfVar54[6] + fVar275;
            fVar276 = fVar9 + fVar276;
            auVar237 = ZEXT3264(CONCAT428(fVar10 + auVar237._28_4_,
                                          CONCAT424(fVar10 * pfVar54[0xe] + auVar237._24_4_,
                                                    CONCAT420(fVar10 * pfVar54[0xd] +
                                                              auVar237._20_4_,
                                                              CONCAT416(fVar10 * pfVar54[0xc] +
                                                                        auVar237._16_4_,
                                                                        CONCAT412(fVar10 * pfVar54[
                                                  0xb] + auVar237._12_4_,
                                                  CONCAT48(fVar10 * pfVar54[10] + auVar237._8_4_,
                                                           CONCAT44(fVar10 * pfVar54[9] +
                                                                    auVar237._4_4_,
                                                                    fVar10 * pfVar54[8] +
                                                                    auVar237._0_4_))))))));
            fVar100 = fVar11 * pfVar54[0x10] + fVar100;
            fVar141 = fVar11 * pfVar54[0x11] + fVar141;
            fVar142 = fVar11 * pfVar54[0x12] + fVar142;
            fVar143 = fVar11 * pfVar54[0x13] + fVar143;
            fVar144 = fVar11 * pfVar54[0x14] + fVar144;
            fVar145 = fVar11 * pfVar54[0x15] + fVar145;
            fVar146 = fVar11 * pfVar54[0x16] + fVar146;
            fVar147 = fVar9 + fVar147;
            fVar277 = fVar12 * pfVar54[0x18] + fVar277;
            fVar280 = fVar12 * pfVar54[0x19] + fVar280;
            fVar281 = fVar12 * pfVar54[0x1a] + fVar281;
            fVar282 = fVar12 * pfVar54[0x1b] + fVar282;
            fVar283 = fVar12 * pfVar54[0x1c] + fVar283;
            fVar284 = fVar12 * pfVar54[0x1d] + fVar284;
            fVar285 = fVar12 * pfVar54[0x1e] + fVar285;
            fVar286 = fVar9 + fVar286;
            fVar9 = pfVar51[4];
            fVar10 = pfVar51[5];
            fVar11 = pfVar51[6];
            fVar12 = pfVar51[7];
            auVar243._0_4_ = fVar9 * pfVar54[0x20] + auVar245._0_4_;
            auVar243._4_4_ = fVar9 * pfVar54[0x21] + auVar245._4_4_;
            auVar243._8_4_ = fVar9 * pfVar54[0x22] + auVar245._8_4_;
            auVar243._12_4_ = fVar9 * pfVar54[0x23] + auVar245._12_4_;
            auVar243._16_4_ = fVar9 * pfVar54[0x24] + auVar245._16_4_;
            auVar243._20_4_ = fVar9 * pfVar54[0x25] + auVar245._20_4_;
            auVar243._24_4_ = fVar9 * pfVar54[0x26] + auVar245._24_4_;
            auVar243._28_4_ = fVar9 + auVar245._28_4_;
            auVar245 = ZEXT3264(auVar243);
            fVar182 = fVar10 * pfVar54[0x28] + fVar182;
            fVar207 = fVar10 * pfVar54[0x29] + fVar207;
            fVar208 = fVar10 * pfVar54[0x2a] + fVar208;
            fVar209 = fVar10 * pfVar54[0x2b] + fVar209;
            fVar210 = fVar10 * pfVar54[0x2c] + fVar210;
            fVar211 = fVar10 * pfVar54[0x2d] + fVar211;
            fVar212 = fVar10 * pfVar54[0x2e] + fVar212;
            fVar213 = fVar10 + fVar213;
            auVar248._0_4_ = fVar11 * pfVar54[0x30] + auVar251._0_4_;
            auVar248._4_4_ = fVar11 * pfVar54[0x31] + auVar251._4_4_;
            auVar248._8_4_ = fVar11 * pfVar54[0x32] + auVar251._8_4_;
            auVar248._12_4_ = fVar11 * pfVar54[0x33] + auVar251._12_4_;
            auVar248._16_4_ = fVar11 * pfVar54[0x34] + auVar251._16_4_;
            auVar248._20_4_ = fVar11 * pfVar54[0x35] + auVar251._20_4_;
            auVar248._24_4_ = fVar11 * pfVar54[0x36] + auVar251._24_4_;
            auVar248._28_4_ = fVar9 + auVar251._28_4_;
            auVar251 = ZEXT3264(auVar248);
            fVar148 = fVar12 * pfVar54[0x38] + fVar148;
            fVar175 = fVar12 * pfVar54[0x39] + fVar175;
            fVar176 = fVar12 * pfVar54[0x3a] + fVar176;
            fVar177 = fVar12 * pfVar54[0x3b] + fVar177;
            fVar178 = fVar12 * pfVar54[0x3c] + fVar178;
            fVar179 = fVar12 * pfVar54[0x3d] + fVar179;
            fVar180 = fVar12 * pfVar54[0x3e] + fVar180;
            fVar181 = fVar9 + fVar181;
            pfVar51 = pfVar51 + 8;
            pfVar54 = pfVar54 + 0x40;
            iVar42 = iVar42 + 8;
            uVar59 = uVar62 & 0xfffffff8;
          } while (iVar42 < (int)uVar62);
        }
        uVar58 = uVar59 | 3;
        while( true ) {
          if ((int)uVar62 <= (int)uVar58) break;
          fVar9 = *pfVar51;
          fVar10 = pfVar51[1];
          fVar11 = pfVar51[2];
          fVar12 = pfVar51[3];
          fVar267 = fVar9 * *pfVar54 + fVar267;
          fVar270 = fVar9 * pfVar54[1] + fVar270;
          fVar271 = fVar9 * pfVar54[2] + fVar271;
          fVar272 = fVar9 * pfVar54[3] + fVar272;
          fVar273 = fVar9 * pfVar54[4] + fVar273;
          fVar274 = fVar9 * pfVar54[5] + fVar274;
          fVar275 = fVar9 * pfVar54[6] + fVar275;
          fVar276 = fVar9 + fVar276;
          auVar237 = ZEXT3264(CONCAT428(fVar9 + auVar237._28_4_,
                                        CONCAT424(fVar10 * pfVar54[0xe] + auVar237._24_4_,
                                                  CONCAT420(fVar10 * pfVar54[0xd] + auVar237._20_4_,
                                                            CONCAT416(fVar10 * pfVar54[0xc] +
                                                                      auVar237._16_4_,
                                                                      CONCAT412(fVar10 * pfVar54[0xb
                                                  ] + auVar237._12_4_,
                                                  CONCAT48(fVar10 * pfVar54[10] + auVar237._8_4_,
                                                           CONCAT44(fVar10 * pfVar54[9] +
                                                                    auVar237._4_4_,
                                                                    fVar10 * pfVar54[8] +
                                                                    auVar237._0_4_))))))));
          fVar100 = fVar11 * pfVar54[0x10] + fVar100;
          fVar141 = fVar11 * pfVar54[0x11] + fVar141;
          fVar142 = fVar11 * pfVar54[0x12] + fVar142;
          fVar143 = fVar11 * pfVar54[0x13] + fVar143;
          fVar144 = fVar11 * pfVar54[0x14] + fVar144;
          fVar145 = fVar11 * pfVar54[0x15] + fVar145;
          fVar146 = fVar11 * pfVar54[0x16] + fVar146;
          fVar147 = fVar9 + fVar147;
          fVar277 = fVar12 * pfVar54[0x18] + fVar277;
          fVar280 = fVar12 * pfVar54[0x19] + fVar280;
          fVar281 = fVar12 * pfVar54[0x1a] + fVar281;
          fVar282 = fVar12 * pfVar54[0x1b] + fVar282;
          fVar283 = fVar12 * pfVar54[0x1c] + fVar283;
          fVar284 = fVar12 * pfVar54[0x1d] + fVar284;
          fVar285 = fVar12 * pfVar54[0x1e] + fVar285;
          fVar286 = fVar10 + fVar286;
          pfVar51 = pfVar51 + 4;
          pfVar54 = pfVar54 + 0x20;
          uVar58 = uVar59 + 7;
          uVar59 = uVar59 + 4;
        }
        if (uVar62 - uVar59 != 0 && (int)uVar59 <= (int)uVar62) {
          lVar56 = 0;
          do {
            fVar9 = pfVar51[lVar56];
            fVar267 = fVar9 * *pfVar54 + fVar267;
            fVar270 = fVar9 * pfVar54[1] + fVar270;
            fVar271 = fVar9 * pfVar54[2] + fVar271;
            fVar272 = fVar9 * pfVar54[3] + fVar272;
            fVar273 = fVar9 * pfVar54[4] + fVar273;
            fVar274 = fVar9 * pfVar54[5] + fVar274;
            fVar275 = fVar9 * pfVar54[6] + fVar275;
            fVar276 = fVar9 + fVar276;
            pfVar54 = pfVar54 + 8;
            lVar56 = lVar56 + 1;
          } while (uVar62 - uVar59 != (int)lVar56);
        }
        fVar213 = auVar243._28_4_ + fVar213;
        fVar267 = fVar267 + auVar248._0_4_ + fVar148 + auVar243._0_4_ + fVar182 +
                            fVar277 + fVar100 + auVar237._0_4_;
        fVar270 = fVar270 + auVar248._4_4_ + fVar175 + auVar243._4_4_ + fVar207 +
                            fVar280 + fVar141 + auVar237._4_4_;
        auVar122._0_8_ = CONCAT44(fVar270,fVar267);
        auVar122._8_4_ =
             fVar271 + auVar248._8_4_ + fVar176 + auVar243._8_4_ + fVar208 +
                       fVar281 + fVar142 + auVar237._8_4_;
        auVar122._12_4_ =
             fVar272 + auVar248._12_4_ + fVar177 + auVar243._12_4_ + fVar209 +
                       fVar282 + fVar143 + auVar237._12_4_;
        auVar122._16_4_ =
             fVar273 + auVar248._16_4_ + fVar178 + auVar243._16_4_ + fVar210 +
                       fVar283 + fVar144 + auVar237._16_4_;
        auVar122._20_4_ =
             fVar274 + auVar248._20_4_ + fVar179 + auVar243._20_4_ + fVar211 +
                       fVar284 + fVar145 + auVar237._20_4_;
        auVar122._24_4_ =
             fVar275 + auVar248._24_4_ + fVar180 + auVar243._24_4_ + fVar212 +
                       fVar285 + fVar146 + auVar237._24_4_;
        auVar122._28_4_ =
             fVar276 + auVar248._28_4_ + fVar181 + fVar213 + fVar286 + fVar147 + auVar237._28_4_;
        auVar90 = auVar99._0_32_;
        fVar273 = auVar226._4_4_;
        fVar276 = auVar226._8_4_;
        fVar100 = auVar226._12_4_;
        fVar142 = auVar226._16_4_;
        fVar145 = auVar226._20_4_;
        fVar147 = auVar226._24_4_;
        fVar280 = auVar226._28_4_;
        fVar271 = auVar99._0_4_;
        fVar274 = auVar99._4_4_;
        fVar275 = auVar99._8_4_;
        fVar141 = auVar99._12_4_;
        fVar143 = auVar99._16_4_;
        fVar144 = auVar99._20_4_;
        fVar146 = auVar99._24_4_;
        fVar277 = auVar99._28_4_;
        fVar272 = auVar226._0_4_;
        switch(uVar44) {
        case 1:
          auVar122 = vmaxps_avx(auVar122,_DAT_00598560);
          break;
        case 2:
          auVar90 = vmaxps_avx(auVar122,ZEXT1632(ZEXT816(0) << 0x40));
          auVar243 = vminps_avx(auVar122,ZEXT1632(ZEXT816(0) << 0x40));
          fVar267 = **(float **)(&this->field_0xe8 + (long)p_Var24);
          auVar122._0_4_ = fVar267 * auVar243._0_4_ + auVar90._0_4_;
          auVar122._4_4_ = fVar267 * auVar243._4_4_ + auVar90._4_4_;
          auVar122._8_4_ = fVar267 * auVar243._8_4_ + auVar90._8_4_;
          auVar122._12_4_ = fVar267 * auVar243._12_4_ + auVar90._12_4_;
          auVar122._16_4_ = fVar267 * auVar243._16_4_ + auVar90._16_4_;
          auVar122._20_4_ = fVar267 * auVar243._20_4_ + auVar90._20_4_;
          auVar122._24_4_ = fVar267 * auVar243._24_4_ + auVar90._24_4_;
          auVar122._28_4_ = auVar243._28_4_ + auVar90._28_4_;
          break;
        case 3:
          uVar13 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var24);
          auVar165._4_4_ = uVar13;
          auVar165._0_4_ = uVar13;
          auVar165._8_4_ = uVar13;
          auVar165._12_4_ = uVar13;
          auVar165._16_4_ = uVar13;
          auVar165._20_4_ = uVar13;
          auVar165._24_4_ = uVar13;
          auVar165._28_4_ = uVar13;
          uVar13 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var24))[1];
          auVar204._4_4_ = uVar13;
          auVar204._0_4_ = uVar13;
          auVar204._8_4_ = uVar13;
          auVar204._12_4_ = uVar13;
          auVar204._16_4_ = uVar13;
          auVar204._20_4_ = uVar13;
          auVar204._24_4_ = uVar13;
          auVar204._28_4_ = uVar13;
          auVar90 = vmaxps_avx(auVar122,auVar165);
          auVar122 = vminps_avx(auVar90,auVar204);
          break;
        case 4:
          auVar123._0_8_ = auVar122._0_8_ ^ 0x8000000080000000;
          auVar123._8_4_ = -auVar122._8_4_;
          auVar123._12_4_ = -auVar122._12_4_;
          auVar123._16_4_ = -auVar122._16_4_;
          auVar123._20_4_ = -auVar122._20_4_;
          auVar123._24_4_ = -auVar122._24_4_;
          auVar123._28_4_ = -auVar122._28_4_;
          auVar166._8_4_ = 0x42b0c0a5;
          auVar166._0_8_ = 0x42b0c0a542b0c0a5;
          auVar166._12_4_ = 0x42b0c0a5;
          auVar166._16_4_ = 0x42b0c0a5;
          auVar166._20_4_ = 0x42b0c0a5;
          auVar166._24_4_ = 0x42b0c0a5;
          auVar166._28_4_ = 0x42b0c0a5;
          auVar243 = vminps_avx(auVar123,auVar166);
          auVar167._8_4_ = 0xc2b0c0a5;
          auVar167._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar167._12_4_ = 0xc2b0c0a5;
          auVar167._16_4_ = 0xc2b0c0a5;
          auVar167._20_4_ = 0xc2b0c0a5;
          auVar167._24_4_ = 0xc2b0c0a5;
          auVar167._28_4_ = 0xc2b0c0a5;
          auVar248 = vmaxps_avx(auVar243,auVar167);
          auVar168._0_4_ = auVar248._0_4_ * 1.442695 + fVar272;
          auVar168._4_4_ = auVar248._4_4_ * 1.442695 + fVar273;
          auVar168._8_4_ = auVar248._8_4_ * 1.442695 + fVar276;
          auVar168._12_4_ = auVar248._12_4_ * 1.442695 + fVar100;
          auVar168._16_4_ = auVar248._16_4_ * 1.442695 + fVar142;
          auVar168._20_4_ = auVar248._20_4_ * 1.442695 + fVar145;
          auVar168._24_4_ = auVar248._24_4_ * 1.442695 + fVar147;
          auVar168._28_4_ = fVar280 + 1.442695;
          auVar122 = vroundps_avx(auVar168,1);
          auVar243 = vcmpps_avx(auVar168,auVar122,1);
          auVar243 = vandps_avx(auVar243,auVar90);
          auVar243 = vsubps_avx(auVar122,auVar243);
          fVar267 = auVar248._0_4_ + auVar243._0_4_ * -0.6931472;
          fVar270 = auVar248._4_4_ + auVar243._4_4_ * -0.6931472;
          fVar280 = auVar248._8_4_ + auVar243._8_4_ * -0.6931472;
          fVar281 = auVar248._12_4_ + auVar243._12_4_ * -0.6931472;
          fVar282 = auVar248._16_4_ + auVar243._16_4_ * -0.6931472;
          fVar283 = auVar248._20_4_ + auVar243._20_4_ * -0.6931472;
          fVar284 = auVar248._24_4_ + auVar243._24_4_ * -0.6931472;
          auVar149._0_4_ = (int)auVar243._0_4_;
          auVar149._4_4_ = (int)auVar243._4_4_;
          auVar149._8_4_ = (int)auVar243._8_4_;
          auVar149._12_4_ = (int)auVar243._12_4_;
          auVar169._16_4_ = (int)auVar243._16_4_;
          auVar169._0_16_ = auVar149;
          auVar169._20_4_ = (int)auVar243._20_4_;
          auVar169._24_4_ = (int)auVar243._24_4_;
          auVar169._28_4_ = (int)auVar243._28_4_;
          auVar227 = vpslld_avx(auVar149,0x17);
          auVar184 = vpslld_avx(auVar169._16_16_,0x17);
          auVar63._8_4_ = 0x3f800000;
          auVar63._0_8_ = 0x3f8000003f800000;
          auVar63._12_4_ = 0x3f800000;
          auVar184 = vpaddd_avx(auVar184,auVar63);
          auVar227 = vpaddd_avx(auVar227,auVar63);
          auVar124._0_4_ =
               (fVar267 + fVar271 +
               fVar267 * fVar267 *
               (((((fVar267 * 0.00019875691 + 0.0013981999) * fVar267 + 0.008333452) * fVar267 +
                 0.041665796) * fVar267 + 0.16666666) * fVar267 + fVar272)) * auVar227._0_4_ +
               fVar271;
          auVar124._4_4_ =
               (fVar270 + fVar274 +
               fVar270 * fVar270 *
               (((((fVar270 * 0.00019875691 + 0.0013981999) * fVar270 + 0.008333452) * fVar270 +
                 0.041665796) * fVar270 + 0.16666666) * fVar270 + fVar273)) * auVar227._4_4_ +
               fVar274;
          auVar124._8_4_ =
               (fVar280 + fVar275 +
               fVar280 * fVar280 *
               (((((fVar280 * 0.00019875691 + 0.0013981999) * fVar280 + 0.008333452) * fVar280 +
                 0.041665796) * fVar280 + 0.16666666) * fVar280 + fVar276)) * auVar227._8_4_ +
               fVar275;
          auVar124._12_4_ =
               (fVar281 + fVar141 +
               fVar281 * fVar281 *
               (((((fVar281 * 0.00019875691 + 0.0013981999) * fVar281 + 0.008333452) * fVar281 +
                 0.041665796) * fVar281 + 0.16666666) * fVar281 + fVar100)) * auVar227._12_4_ +
               fVar141;
          auVar124._16_4_ =
               (fVar282 + fVar143 +
               fVar282 * fVar282 *
               (((((fVar282 * 0.00019875691 + 0.0013981999) * fVar282 + 0.008333452) * fVar282 +
                 0.041665796) * fVar282 + 0.16666666) * fVar282 + fVar142)) * auVar184._0_4_ +
               fVar143;
          auVar124._20_4_ =
               (fVar283 + fVar144 +
               fVar283 * fVar283 *
               (((((fVar283 * 0.00019875691 + 0.0013981999) * fVar283 + 0.008333452) * fVar283 +
                 0.041665796) * fVar283 + 0.16666666) * fVar283 + fVar145)) * auVar184._4_4_ +
               fVar144;
          auVar124._24_4_ =
               (fVar284 + fVar146 +
               fVar284 * fVar284 *
               (((((fVar284 * 0.00019875691 + 0.0013981999) * fVar284 + 0.008333452) * fVar284 +
                 0.041665796) * fVar284 + 0.16666666) * fVar284 + fVar147)) * auVar184._8_4_ +
               fVar146;
          auVar124._28_4_ = auVar248._28_4_ + -0.6931472 + fVar277 + -0.6931472 + fVar277;
          auVar243 = vrcpps_avx(auVar124);
          fVar267 = auVar243._0_4_;
          fVar270 = auVar243._4_4_;
          auVar35._4_4_ = auVar124._4_4_ * fVar270;
          auVar35._0_4_ = auVar124._0_4_ * fVar267;
          fVar271 = auVar243._8_4_;
          auVar35._8_4_ = auVar124._8_4_ * fVar271;
          fVar272 = auVar243._12_4_;
          auVar35._12_4_ = auVar124._12_4_ * fVar272;
          fVar273 = auVar243._16_4_;
          auVar35._16_4_ = auVar124._16_4_ * fVar273;
          fVar274 = auVar243._20_4_;
          auVar35._20_4_ = auVar124._20_4_ * fVar274;
          fVar275 = auVar243._24_4_;
          auVar35._24_4_ = auVar124._24_4_ * fVar275;
          auVar35._28_4_ = auVar124._28_4_;
          auVar90 = vsubps_avx(auVar90,auVar35);
          auVar122._0_4_ = fVar267 + fVar267 * auVar90._0_4_;
          auVar122._4_4_ = fVar270 + fVar270 * auVar90._4_4_;
          auVar122._8_4_ = fVar271 + fVar271 * auVar90._8_4_;
          auVar122._12_4_ = fVar272 + fVar272 * auVar90._12_4_;
          auVar122._16_4_ = fVar273 + fVar273 * auVar90._16_4_;
          auVar122._20_4_ = fVar274 + fVar274 * auVar90._20_4_;
          auVar122._24_4_ = fVar275 + fVar275 * auVar90._24_4_;
          auVar122._28_4_ = auVar243._28_4_ + auVar90._28_4_;
          break;
        case 5:
          auVar258._8_4_ = 0x42b0c0a5;
          auVar258._0_8_ = 0x42b0c0a542b0c0a5;
          auVar258._12_4_ = 0x42b0c0a5;
          auVar258._16_4_ = 0x42b0c0a5;
          auVar258._20_4_ = 0x42b0c0a5;
          auVar258._24_4_ = 0x42b0c0a5;
          auVar258._28_4_ = 0x42b0c0a5;
          auVar243 = vminps_avx(auVar258,auVar122);
          auVar264._8_4_ = 0xc2b0c0a5;
          auVar264._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar264._12_4_ = 0xc2b0c0a5;
          auVar264._16_4_ = 0xc2b0c0a5;
          auVar264._20_4_ = 0xc2b0c0a5;
          auVar264._24_4_ = 0xc2b0c0a5;
          auVar264._28_4_ = 0xc2b0c0a5;
          auVar248 = vmaxps_avx(auVar264,auVar243);
          auVar196._0_4_ = auVar248._0_4_ * 1.442695 + fVar272;
          auVar196._4_4_ = auVar248._4_4_ * 1.442695 + fVar273;
          auVar196._8_4_ = auVar248._8_4_ * 1.442695 + fVar276;
          auVar196._12_4_ = auVar248._12_4_ * 1.442695 + fVar100;
          auVar196._16_4_ = auVar248._16_4_ * 1.442695 + fVar142;
          auVar196._20_4_ = auVar248._20_4_ * 1.442695 + fVar145;
          auVar196._24_4_ = auVar248._24_4_ * 1.442695 + fVar147;
          auVar196._28_4_ = fVar213 + fVar280;
          auVar170 = vroundps_avx(auVar196,1);
          auVar243 = vcmpps_avx(auVar196,auVar170,1);
          auVar243 = vandps_avx(auVar243,auVar90);
          auVar243 = vsubps_avx(auVar170,auVar243);
          auVar29._4_4_ = auVar243._4_4_ * 0.6931472;
          auVar29._0_4_ = auVar243._0_4_ * 0.6931472;
          auVar29._8_4_ = auVar243._8_4_ * 0.6931472;
          auVar29._12_4_ = auVar243._12_4_ * 0.6931472;
          auVar29._16_4_ = auVar243._16_4_ * 0.6931472;
          auVar29._20_4_ = auVar243._20_4_ * 0.6931472;
          auVar29._24_4_ = auVar243._24_4_ * 0.6931472;
          auVar29._28_4_ = auVar170._28_4_;
          auVar248 = vsubps_avx(auVar248,auVar29);
          fVar281 = auVar248._0_4_;
          fVar282 = auVar248._4_4_;
          fVar283 = auVar248._8_4_;
          fVar284 = auVar248._12_4_;
          fVar285 = auVar248._16_4_;
          fVar286 = auVar248._20_4_;
          fVar148 = auVar248._24_4_;
          auVar183._0_4_ = (int)auVar243._0_4_;
          auVar183._4_4_ = (int)auVar243._4_4_;
          auVar183._8_4_ = (int)auVar243._8_4_;
          auVar183._12_4_ = (int)auVar243._12_4_;
          auVar197._16_4_ = (int)auVar243._16_4_;
          auVar197._0_16_ = auVar183;
          auVar197._20_4_ = (int)auVar243._20_4_;
          auVar197._24_4_ = (int)auVar243._24_4_;
          auVar197._28_4_ = (int)auVar243._28_4_;
          auVar227 = vpslld_avx(auVar183,0x17);
          auVar184 = vpslld_avx(auVar197._16_16_,0x17);
          auVar214._8_4_ = 0x3f800000;
          auVar214._0_8_ = 0x3f8000003f800000;
          auVar214._12_4_ = 0x3f800000;
          auVar184 = vpaddd_avx(auVar184,auVar214);
          auVar227 = vpaddd_avx(auVar227,auVar214);
          auVar163._0_4_ =
               (fVar281 + fVar271 +
               (((((fVar281 * 0.00019875691 + 0.0013981999) * fVar281 + 0.008333452) * fVar281 +
                 0.041665796) * fVar281 + 0.16666666) * fVar281 + fVar272) * fVar281 * fVar281) *
               auVar227._0_4_ + fVar271;
          auVar163._4_4_ =
               (fVar282 + fVar274 +
               (((((fVar282 * 0.00019875691 + 0.0013981999) * fVar282 + 0.008333452) * fVar282 +
                 0.041665796) * fVar282 + 0.16666666) * fVar282 + fVar273) * fVar282 * fVar282) *
               auVar227._4_4_ + fVar274;
          auVar163._8_4_ =
               (fVar283 + fVar275 +
               (((((fVar283 * 0.00019875691 + 0.0013981999) * fVar283 + 0.008333452) * fVar283 +
                 0.041665796) * fVar283 + 0.16666666) * fVar283 + fVar276) * fVar283 * fVar283) *
               auVar227._8_4_ + fVar275;
          auVar163._12_4_ =
               (fVar284 + fVar141 +
               (((((fVar284 * 0.00019875691 + 0.0013981999) * fVar284 + 0.008333452) * fVar284 +
                 0.041665796) * fVar284 + 0.16666666) * fVar284 + fVar100) * fVar284 * fVar284) *
               auVar227._12_4_ + fVar141;
          auVar163._16_4_ =
               (fVar285 + fVar143 +
               (((((fVar285 * 0.00019875691 + 0.0013981999) * fVar285 + 0.008333452) * fVar285 +
                 0.041665796) * fVar285 + 0.16666666) * fVar285 + fVar142) * fVar285 * fVar285) *
               auVar184._0_4_ + fVar143;
          auVar163._20_4_ =
               (fVar286 + fVar144 +
               (((((fVar286 * 0.00019875691 + 0.0013981999) * fVar286 + 0.008333452) * fVar286 +
                 0.041665796) * fVar286 + 0.16666666) * fVar286 + fVar145) * fVar286 * fVar286) *
               auVar184._4_4_ + fVar144;
          auVar163._24_4_ =
               (fVar148 + fVar146 +
               (((((fVar148 * 0.00019875691 + 0.0013981999) * fVar148 + 0.008333452) * fVar148 +
                 0.041665796) * fVar148 + 0.16666666) * fVar148 + fVar147) * fVar148 * fVar148) *
               auVar184._8_4_ + fVar146;
          auVar163._28_4_ = auVar248._28_4_ + fVar277 + auVar170._28_4_ + fVar277;
          auVar198._8_4_ = 0x800000;
          auVar198._0_8_ = 0x80000000800000;
          auVar198._12_4_ = 0x800000;
          auVar198._16_4_ = 0x800000;
          auVar198._20_4_ = 0x800000;
          auVar198._24_4_ = 0x800000;
          auVar198._28_4_ = 0x800000;
          auVar170 = vmaxps_avx(auVar163,auVar198);
          auVar184 = vpsrld_avx(auVar170._16_16_,0x17);
          auVar199._8_4_ = 0x807fffff;
          auVar199._0_8_ = 0x807fffff807fffff;
          auVar199._12_4_ = 0x807fffff;
          auVar199._16_4_ = 0x807fffff;
          auVar199._20_4_ = 0x807fffff;
          auVar199._24_4_ = 0x807fffff;
          auVar199._28_4_ = 0x807fffff;
          auVar243 = vandps_avx(auVar170,auVar199);
          auVar29 = vorps_avx(auVar243,auVar226._0_32_);
          auVar224._8_4_ = 0x3f3504f3;
          auVar224._0_8_ = 0x3f3504f33f3504f3;
          auVar224._12_4_ = 0x3f3504f3;
          auVar224._16_4_ = 0x3f3504f3;
          auVar224._20_4_ = 0x3f3504f3;
          auVar224._24_4_ = 0x3f3504f3;
          auVar224._28_4_ = 0x3f3504f3;
          auVar248 = vcmpps_avx(auVar224,auVar29,2);
          auVar243 = vandnps_avx(auVar248,auVar29);
          fVar281 = auVar243._0_4_ + auVar29._0_4_ + -1.0;
          fVar282 = auVar243._4_4_ + auVar29._4_4_ + -1.0;
          fVar283 = auVar243._8_4_ + auVar29._8_4_ + -1.0;
          fVar284 = auVar243._12_4_ + auVar29._12_4_ + -1.0;
          fVar285 = auVar243._16_4_ + auVar29._16_4_ + -1.0;
          fVar286 = auVar243._20_4_ + auVar29._20_4_ + -1.0;
          fVar148 = auVar243._24_4_ + auVar29._24_4_ + -1.0;
          auVar184 = vpsubd_avx(auVar184,auVar248._16_16_);
          auVar227 = vpsrld_avx(auVar170._0_16_,0x17);
          auVar220._8_4_ = 0xffffff81;
          auVar220._0_8_ = 0xffffff81ffffff81;
          auVar220._12_4_ = 0xffffff81;
          auVar184 = vpaddd_avx(auVar184,auVar220);
          auVar227 = vpsubd_avx(auVar227,auVar248._0_16_);
          auVar227 = vpaddd_avx(auVar227,auVar220);
          auVar233._16_16_ = auVar184;
          auVar233._0_16_ = auVar227;
          auVar248 = vcmpps_avx(auVar163,_DAT_00598560,2);
          auVar170 = vcvtdq2ps_avx(auVar233);
          auVar32._4_4_ =
               (fVar282 * fVar282 *
                (((((((((fVar282 * 0.070376836 + -0.1151461) * fVar282 + 0.116769984) * fVar282 +
                      -0.12420141) * fVar282 + 0.14249323) * fVar282 + -0.16668057) * fVar282 +
                   0.20000714) * fVar282 + -0.24999994) * fVar282 + 0.3333333) * fVar282 + -0.5) +
               auVar170._4_4_ * 0.6931472 + fVar282) * -2.0;
          auVar32._0_4_ =
               (fVar281 * fVar281 *
                (((((((((fVar281 * 0.070376836 + -0.1151461) * fVar281 + 0.116769984) * fVar281 +
                      -0.12420141) * fVar281 + 0.14249323) * fVar281 + -0.16668057) * fVar281 +
                   0.20000714) * fVar281 + -0.24999994) * fVar281 + 0.3333333) * fVar281 + -0.5) +
               auVar170._0_4_ * 0.6931472 + fVar281) * -2.0;
          auVar32._8_4_ =
               (fVar283 * fVar283 *
                (((((((((fVar283 * 0.070376836 + -0.1151461) * fVar283 + 0.116769984) * fVar283 +
                      -0.12420141) * fVar283 + 0.14249323) * fVar283 + -0.16668057) * fVar283 +
                   0.20000714) * fVar283 + -0.24999994) * fVar283 + 0.3333333) * fVar283 + -0.5) +
               auVar170._8_4_ * 0.6931472 + fVar283) * -2.0;
          auVar32._12_4_ =
               (fVar284 * fVar284 *
                (((((((((fVar284 * 0.070376836 + -0.1151461) * fVar284 + 0.116769984) * fVar284 +
                      -0.12420141) * fVar284 + 0.14249323) * fVar284 + -0.16668057) * fVar284 +
                   0.20000714) * fVar284 + -0.24999994) * fVar284 + 0.3333333) * fVar284 + -0.5) +
               auVar170._12_4_ * 0.6931472 + fVar284) * -2.0;
          auVar32._16_4_ =
               (fVar285 * fVar285 *
                (((((((((fVar285 * 0.070376836 + -0.1151461) * fVar285 + 0.116769984) * fVar285 +
                      -0.12420141) * fVar285 + 0.14249323) * fVar285 + -0.16668057) * fVar285 +
                   0.20000714) * fVar285 + -0.24999994) * fVar285 + 0.3333333) * fVar285 + -0.5) +
               auVar170._16_4_ * 0.6931472 + fVar285) * -2.0;
          auVar32._20_4_ =
               (fVar286 * fVar286 *
                (((((((((fVar286 * 0.070376836 + -0.1151461) * fVar286 + 0.116769984) * fVar286 +
                      -0.12420141) * fVar286 + 0.14249323) * fVar286 + -0.16668057) * fVar286 +
                   0.20000714) * fVar286 + -0.24999994) * fVar286 + 0.3333333) * fVar286 + -0.5) +
               auVar170._20_4_ * 0.6931472 + fVar286) * -2.0;
          auVar32._24_4_ =
               (fVar148 * fVar148 *
                (((((((((fVar148 * 0.070376836 + -0.1151461) * fVar148 + 0.116769984) * fVar148 +
                      -0.12420141) * fVar148 + 0.14249323) * fVar148 + -0.16668057) * fVar148 +
                   0.20000714) * fVar148 + -0.24999994) * fVar148 + 0.3333333) * fVar148 + -0.5) +
               auVar170._24_4_ * 0.6931472 + fVar148) * -2.0;
          auVar32._28_4_ = auVar170._28_4_ + auVar243._28_4_ + auVar29._28_4_ + -1.0 + 0.0;
          auVar225._8_4_ = 0x7fffffff;
          auVar225._0_8_ = 0x7fffffff7fffffff;
          auVar225._12_4_ = 0x7fffffff;
          auVar225._16_4_ = 0x7fffffff;
          auVar225._20_4_ = 0x7fffffff;
          auVar225._24_4_ = 0x7fffffff;
          auVar225._28_4_ = 0x7fffffff;
          auVar243 = vblendvps_avx(auVar32,auVar225,auVar248);
          auVar200._8_4_ = 0x42b0c0a5;
          auVar200._0_8_ = 0x42b0c0a542b0c0a5;
          auVar200._12_4_ = 0x42b0c0a5;
          auVar200._16_4_ = 0x42b0c0a5;
          auVar200._20_4_ = 0x42b0c0a5;
          auVar200._24_4_ = 0x42b0c0a5;
          auVar200._28_4_ = 0x42b0c0a5;
          auVar243 = vminps_avx(auVar243,auVar200);
          auVar201._8_4_ = 0xc2b0c0a5;
          auVar201._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar201._12_4_ = 0xc2b0c0a5;
          auVar201._16_4_ = 0xc2b0c0a5;
          auVar201._20_4_ = 0xc2b0c0a5;
          auVar201._24_4_ = 0xc2b0c0a5;
          auVar201._28_4_ = 0xc2b0c0a5;
          auVar248 = vmaxps_avx(auVar243,auVar201);
          auVar202._0_4_ = auVar248._0_4_ * 1.442695 + fVar272;
          auVar202._4_4_ = auVar248._4_4_ * 1.442695 + fVar273;
          auVar202._8_4_ = auVar248._8_4_ * 1.442695 + fVar276;
          auVar202._12_4_ = auVar248._12_4_ * 1.442695 + fVar100;
          auVar202._16_4_ = auVar248._16_4_ * 1.442695 + fVar142;
          auVar202._20_4_ = auVar248._20_4_ * 1.442695 + fVar145;
          auVar202._24_4_ = auVar248._24_4_ * 1.442695 + fVar147;
          auVar202._28_4_ = fVar280 + 1.442695;
          auVar170 = vroundps_avx(auVar202,1);
          auVar243 = vcmpps_avx(auVar202,auVar170,1);
          auVar243 = vandps_avx(auVar243,auVar90);
          auVar243 = vsubps_avx(auVar170,auVar243);
          auVar33._4_4_ = auVar243._4_4_ * 0.6931472;
          auVar33._0_4_ = auVar243._0_4_ * 0.6931472;
          auVar33._8_4_ = auVar243._8_4_ * 0.6931472;
          auVar33._12_4_ = auVar243._12_4_ * 0.6931472;
          auVar33._16_4_ = auVar243._16_4_ * 0.6931472;
          auVar33._20_4_ = auVar243._20_4_ * 0.6931472;
          auVar33._24_4_ = auVar243._24_4_ * 0.6931472;
          auVar33._28_4_ = auVar170._28_4_;
          auVar248 = vsubps_avx(auVar248,auVar33);
          fVar280 = auVar248._0_4_;
          fVar281 = auVar248._4_4_;
          fVar282 = auVar248._8_4_;
          fVar283 = auVar248._12_4_;
          fVar284 = auVar248._16_4_;
          fVar285 = auVar248._20_4_;
          fVar286 = auVar248._24_4_;
          auVar226 = ZEXT3264(auVar226._0_32_);
          auVar99 = ZEXT3264(auVar90);
          auVar185._0_4_ = (int)auVar243._0_4_;
          auVar185._4_4_ = (int)auVar243._4_4_;
          auVar185._8_4_ = (int)auVar243._8_4_;
          auVar185._12_4_ = (int)auVar243._12_4_;
          auVar203._16_4_ = (int)auVar243._16_4_;
          auVar203._0_16_ = auVar185;
          auVar203._20_4_ = (int)auVar243._20_4_;
          auVar203._24_4_ = (int)auVar243._24_4_;
          auVar203._28_4_ = (int)auVar243._28_4_;
          auVar227 = vpslld_avx(auVar185,0x17);
          auVar184 = vpslld_avx(auVar203._16_16_,0x17);
          auVar184 = vpaddd_avx(auVar184,auVar214);
          auVar227 = vpaddd_avx(auVar227,auVar214);
          auVar164._0_4_ =
               (fVar280 + fVar271 +
               (((((fVar280 * 0.00019875691 + 0.0013981999) * fVar280 + 0.008333452) * fVar280 +
                 0.041665796) * fVar280 + 0.16666666) * fVar280 + fVar272) * fVar280 * fVar280) *
               auVar227._0_4_ + fVar271;
          auVar164._4_4_ =
               (fVar281 + fVar274 +
               (((((fVar281 * 0.00019875691 + 0.0013981999) * fVar281 + 0.008333452) * fVar281 +
                 0.041665796) * fVar281 + 0.16666666) * fVar281 + fVar273) * fVar281 * fVar281) *
               auVar227._4_4_ + fVar274;
          auVar164._8_4_ =
               (fVar282 + fVar275 +
               (((((fVar282 * 0.00019875691 + 0.0013981999) * fVar282 + 0.008333452) * fVar282 +
                 0.041665796) * fVar282 + 0.16666666) * fVar282 + fVar276) * fVar282 * fVar282) *
               auVar227._8_4_ + fVar275;
          auVar164._12_4_ =
               (fVar283 + fVar141 +
               (((((fVar283 * 0.00019875691 + 0.0013981999) * fVar283 + 0.008333452) * fVar283 +
                 0.041665796) * fVar283 + 0.16666666) * fVar283 + fVar100) * fVar283 * fVar283) *
               auVar227._12_4_ + fVar141;
          auVar164._16_4_ =
               (fVar284 + fVar143 +
               (((((fVar284 * 0.00019875691 + 0.0013981999) * fVar284 + 0.008333452) * fVar284 +
                 0.041665796) * fVar284 + 0.16666666) * fVar284 + fVar142) * fVar284 * fVar284) *
               auVar184._0_4_ + fVar143;
          auVar164._20_4_ =
               (fVar285 + fVar144 +
               (((((fVar285 * 0.00019875691 + 0.0013981999) * fVar285 + 0.008333452) * fVar285 +
                 0.041665796) * fVar285 + 0.16666666) * fVar285 + fVar145) * fVar285 * fVar285) *
               auVar184._4_4_ + fVar144;
          auVar164._24_4_ =
               (fVar286 + fVar146 +
               (((((fVar286 * 0.00019875691 + 0.0013981999) * fVar286 + 0.008333452) * fVar286 +
                 0.041665796) * fVar286 + 0.16666666) * fVar286 + fVar147) * fVar286 * fVar286) *
               auVar184._8_4_ + fVar146;
          auVar164._28_4_ = auVar248._28_4_ + fVar277 + auVar170._28_4_ + fVar277;
          auVar90 = vrcpps_avx(auVar164);
          fVar271 = auVar90._0_4_;
          fVar272 = auVar90._4_4_;
          fVar273 = auVar90._8_4_;
          fVar274 = auVar90._12_4_;
          fVar275 = auVar90._16_4_;
          fVar276 = auVar90._20_4_;
          fVar100 = auVar90._24_4_;
          auVar34._4_4_ = auVar164._4_4_ * (fVar272 + fVar272);
          auVar34._0_4_ = auVar164._0_4_ * (fVar271 + fVar271);
          auVar34._8_4_ = auVar164._8_4_ * (fVar273 + fVar273);
          auVar34._12_4_ = auVar164._12_4_ * (fVar274 + fVar274);
          auVar34._16_4_ = auVar164._16_4_ * (fVar275 + fVar275);
          auVar34._20_4_ = auVar164._20_4_ * (fVar276 + fVar276);
          auVar34._24_4_ = auVar164._24_4_ * (fVar100 + fVar100);
          auVar34._28_4_ = auVar164._28_4_;
          auVar70._8_4_ = 0x40000000;
          auVar70._0_8_ = 0x4000000040000000;
          auVar70._12_4_ = 0x40000000;
          auVar70._16_4_ = 0x40000000;
          auVar70._20_4_ = 0x40000000;
          auVar70._24_4_ = 0x40000000;
          auVar70._28_4_ = 0x40000000;
          auVar90 = vsubps_avx(auVar70,auVar34);
          auVar162._0_4_ = fVar271 + fVar271 + -1.0 + fVar271 * auVar90._0_4_;
          auVar162._4_4_ = fVar272 + fVar272 + -1.0 + fVar272 * auVar90._4_4_;
          auVar162._8_4_ = fVar273 + fVar273 + -1.0 + fVar273 * auVar90._8_4_;
          auVar162._12_4_ = fVar274 + fVar274 + -1.0 + fVar274 * auVar90._12_4_;
          auVar162._16_4_ = fVar275 + fVar275 + -1.0 + fVar275 * auVar90._16_4_;
          auVar162._20_4_ = fVar276 + fVar276 + -1.0 + fVar276 * auVar90._20_4_;
          auVar162._24_4_ = fVar100 + fVar100 + -1.0 + fVar100 * auVar90._24_4_;
          goto LAB_002fee16;
        case 6:
          fVar271 = **(float **)(&this->field_0xe8 + (long)p_Var24);
          fVar272 = (*(float **)(&this->field_0xe8 + (long)p_Var24))[1];
          auVar170._0_4_ = fVar271 * fVar267 + fVar272;
          auVar170._4_4_ = fVar271 * fVar270 + fVar272;
          auVar170._8_4_ = fVar271 * auVar122._8_4_ + fVar272;
          auVar170._12_4_ = fVar271 * auVar122._12_4_ + fVar272;
          auVar170._16_4_ = fVar271 * auVar122._16_4_ + fVar272;
          auVar170._20_4_ = fVar271 * auVar122._20_4_ + fVar272;
          auVar170._24_4_ = fVar271 * auVar122._24_4_ + fVar272;
          auVar170._28_4_ = fVar271 + fVar272;
          auVar243 = vmaxps_avx(auVar170,_DAT_00598560);
          auVar90 = vminps_avx(auVar243,auVar90);
          auVar162 = auVar90._0_28_;
LAB_002fee16:
          auVar122._4_4_ = auVar162._4_4_ * fVar270;
          auVar122._0_4_ = auVar162._0_4_ * fVar267;
          auVar122._8_4_ = auVar162._8_4_ * auVar122._8_4_;
          auVar122._12_4_ = auVar162._12_4_ * auVar122._12_4_;
          auVar122._16_4_ = auVar162._16_4_ * auVar122._16_4_;
          auVar122._20_4_ = auVar162._20_4_ * auVar122._20_4_;
          auVar122._24_4_ = auVar162._24_4_ * auVar122._24_4_;
        }
        *(undefined1 (*) [32])((long)top_blob->data + uVar45 * 0x20) = auVar122;
        uVar45 = uVar45 + 1;
      } while (uVar45 != uVar47);
    }
    goto LAB_0030080e;
  }
  auVar263 = in_ZMM12._0_16_;
  local_d0 = (ulong)(int)uVar47;
  lVar56 = (long)(int)uVar62;
  if (0 < (int)uVar47 >> 3) {
    local_90 = (ulong)(uint)((int)uVar47 >> 3);
    lVar50 = lVar56 * 0x1c;
    local_98 = lVar56 * 0x20;
    lVar49 = lVar56 * 8;
    lVar55 = lVar56 * 0x18;
    local_b0 = lVar56 * 4;
    lVar57 = lVar56 * 0x14;
    lVar60 = lVar56 << 4;
    local_b8 = lVar56 * 0xc;
    local_c0 = 0;
    auVar99 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar226 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar45 = 0;
    do {
      local_80 = uVar45 * 8;
      fVar271 = 0.0;
      fVar272 = 0.0;
      fVar267 = 0.0;
      fVar270 = 0.0;
      fVar273 = 0.0;
      fVar274 = 0.0;
      fVar275 = 0.0;
      fVar276 = 0.0;
      if (lVar26 != 0) {
        pfVar51 = (float *)(lVar26 + uVar45 * 0x20);
        fVar267 = *pfVar51;
        fVar270 = pfVar51[1];
        fVar271 = pfVar51[2];
        fVar272 = pfVar51[3];
        fVar273 = pfVar51[4];
        fVar274 = pfVar51[5];
        fVar275 = pfVar51[6];
        fVar276 = pfVar51[7];
      }
      pvVar48 = (this->weight_data_tm).data;
      local_e8._0_8_ = lVar57;
      if ((int)uVar62 < 8) {
        uVar59 = 0;
        lVar1 = local_80 * lVar56 * 4;
        lVar2 = (local_80 | 1) * lVar56 * 4;
        lVar3 = (local_80 | 2) * lVar56 * 4;
        lVar4 = (local_80 | 3) * lVar56 * 4;
        lVar5 = (local_80 | 4) * lVar56 * 4;
        lVar6 = (local_80 | 5) * lVar56 * 4;
        lVar7 = (local_80 | 6) * lVar56 * 4;
        lVar8 = (local_80 | 7) * lVar56 * 4;
        in_ZMM6 = ZEXT864(0);
        auVar91 = ZEXT832(0);
        auVar125 = ZEXT832(0);
        auVar171 = SUB6432(ZEXT864(0),0);
        auVar234 = ZEXT832(0);
        auVar244 = SUB6432(ZEXT864(0),0);
        auVar249 = ZEXT832(0);
        auVar278 = SUB6432(ZEXT864(0),0);
        pfVar51 = local_138;
        local_a0 = lVar50;
      }
      else {
        auVar279 = ZEXT864(0);
        iVar42 = 7;
        lVar61 = 0;
        auVar252 = ZEXT864(0);
        auVar246 = ZEXT864(0);
        auVar238 = ZEXT864(0);
        auVar251 = ZEXT864(0);
        auVar245 = ZEXT864(0);
        auVar237 = ZEXT864(0);
        in_ZMM6 = ZEXT864(0);
        do {
          pfVar51 = (float *)((long)local_138 + lVar61);
          fVar100 = *pfVar51;
          fVar141 = pfVar51[1];
          fVar142 = pfVar51[2];
          fVar143 = pfVar51[3];
          fVar144 = pfVar51[4];
          fVar145 = pfVar51[5];
          fVar146 = pfVar51[6];
          pfVar43 = (float *)((long)pvVar48 + lVar61 + local_c0);
          auVar278._0_4_ = fVar100 * *pfVar43 + auVar279._0_4_;
          auVar278._4_4_ = fVar141 * pfVar43[1] + auVar279._4_4_;
          auVar278._8_4_ = fVar142 * pfVar43[2] + auVar279._8_4_;
          auVar278._12_4_ = fVar143 * pfVar43[3] + auVar279._12_4_;
          auVar278._16_4_ = fVar144 * pfVar43[4] + auVar279._16_4_;
          auVar278._20_4_ = fVar145 * pfVar43[5] + auVar279._20_4_;
          auVar278._24_4_ = fVar146 * pfVar43[6] + auVar279._24_4_;
          fVar147 = in_ZMM11._28_4_;
          auVar278._28_4_ = fVar147 + auVar279._28_4_;
          auVar279 = ZEXT3264(auVar278);
          pfVar43 = (float *)((long)pvVar48 + lVar61 + local_b0);
          pfVar46 = (float *)((long)pvVar48 + lVar61 + lVar49);
          auVar249._0_4_ = fVar100 * *pfVar43 + auVar252._0_4_;
          auVar249._4_4_ = fVar141 * pfVar43[1] + auVar252._4_4_;
          auVar249._8_4_ = fVar142 * pfVar43[2] + auVar252._8_4_;
          auVar249._12_4_ = fVar143 * pfVar43[3] + auVar252._12_4_;
          auVar249._16_4_ = fVar144 * pfVar43[4] + auVar252._16_4_;
          auVar249._20_4_ = fVar145 * pfVar43[5] + auVar252._20_4_;
          auVar249._24_4_ = fVar146 * pfVar43[6] + auVar252._24_4_;
          auVar249._28_4_ = fVar147 + auVar252._28_4_;
          auVar252 = ZEXT3264(auVar249);
          auVar244._0_4_ = fVar100 * *pfVar46 + auVar246._0_4_;
          auVar244._4_4_ = fVar141 * pfVar46[1] + auVar246._4_4_;
          auVar244._8_4_ = fVar142 * pfVar46[2] + auVar246._8_4_;
          auVar244._12_4_ = fVar143 * pfVar46[3] + auVar246._12_4_;
          auVar244._16_4_ = fVar144 * pfVar46[4] + auVar246._16_4_;
          auVar244._20_4_ = fVar145 * pfVar46[5] + auVar246._20_4_;
          auVar244._24_4_ = fVar146 * pfVar46[6] + auVar246._24_4_;
          fVar277 = in_ZMM12._28_4_;
          auVar244._28_4_ = fVar277 + auVar246._28_4_;
          auVar246 = ZEXT3264(auVar244);
          pfVar43 = (float *)((long)pvVar48 + lVar61 + local_b8);
          auVar234._0_4_ = fVar100 * *pfVar43 + auVar238._0_4_;
          auVar234._4_4_ = fVar141 * pfVar43[1] + auVar238._4_4_;
          auVar234._8_4_ = fVar142 * pfVar43[2] + auVar238._8_4_;
          auVar234._12_4_ = fVar143 * pfVar43[3] + auVar238._12_4_;
          auVar234._16_4_ = fVar144 * pfVar43[4] + auVar238._16_4_;
          auVar234._20_4_ = fVar145 * pfVar43[5] + auVar238._20_4_;
          auVar234._24_4_ = fVar146 * pfVar43[6] + auVar238._24_4_;
          auVar234._28_4_ = fVar147 + auVar238._28_4_;
          auVar238 = ZEXT3264(auVar234);
          pfVar43 = (float *)((long)pvVar48 + lVar61 + lVar60);
          auVar171._0_4_ = fVar100 * *pfVar43 + auVar251._0_4_;
          auVar171._4_4_ = fVar141 * pfVar43[1] + auVar251._4_4_;
          auVar171._8_4_ = fVar142 * pfVar43[2] + auVar251._8_4_;
          auVar171._12_4_ = fVar143 * pfVar43[3] + auVar251._12_4_;
          auVar171._16_4_ = fVar144 * pfVar43[4] + auVar251._16_4_;
          auVar171._20_4_ = fVar145 * pfVar43[5] + auVar251._20_4_;
          auVar171._24_4_ = fVar146 * pfVar43[6] + auVar251._24_4_;
          auVar171._28_4_ = fVar147 + auVar251._28_4_;
          auVar251 = ZEXT3264(auVar171);
          pfVar43 = (float *)((long)pvVar48 + lVar61 + lVar57);
          in_ZMM11 = ZEXT3264(CONCAT428(fVar147,CONCAT424(fVar146 * pfVar43[6],
                                                          CONCAT420(fVar145 * pfVar43[5],
                                                                    CONCAT416(fVar144 * pfVar43[4],
                                                                              CONCAT412(fVar143 * 
                                                  pfVar43[3],
                                                  CONCAT48(fVar142 * pfVar43[2],
                                                           CONCAT44(fVar141 * pfVar43[1],
                                                                    fVar100 * *pfVar43))))))));
          pfVar46 = (float *)((long)pvVar48 + lVar61 + lVar55);
          in_ZMM12 = ZEXT3264(CONCAT428(fVar277,CONCAT424(fVar146 * pfVar46[6],
                                                          CONCAT420(fVar145 * pfVar46[5],
                                                                    CONCAT416(fVar144 * pfVar46[4],
                                                                              CONCAT412(fVar143 * 
                                                  pfVar46[3],
                                                  CONCAT48(fVar142 * pfVar46[2],
                                                           CONCAT44(fVar141 * pfVar46[1],
                                                                    fVar100 * *pfVar46))))))));
          auVar125._0_4_ = fVar100 * *pfVar43 + auVar245._0_4_;
          auVar125._4_4_ = fVar141 * pfVar43[1] + auVar245._4_4_;
          auVar125._8_4_ = fVar142 * pfVar43[2] + auVar245._8_4_;
          auVar125._12_4_ = fVar143 * pfVar43[3] + auVar245._12_4_;
          auVar125._16_4_ = fVar144 * pfVar43[4] + auVar245._16_4_;
          auVar125._20_4_ = fVar145 * pfVar43[5] + auVar245._20_4_;
          auVar125._24_4_ = fVar146 * pfVar43[6] + auVar245._24_4_;
          auVar125._28_4_ = fVar147 + auVar245._28_4_;
          auVar245 = ZEXT3264(auVar125);
          auVar91._0_4_ = fVar100 * *pfVar46 + auVar237._0_4_;
          auVar91._4_4_ = fVar141 * pfVar46[1] + auVar237._4_4_;
          auVar91._8_4_ = fVar142 * pfVar46[2] + auVar237._8_4_;
          auVar91._12_4_ = fVar143 * pfVar46[3] + auVar237._12_4_;
          auVar91._16_4_ = fVar144 * pfVar46[4] + auVar237._16_4_;
          auVar91._20_4_ = fVar145 * pfVar46[5] + auVar237._20_4_;
          auVar91._24_4_ = fVar146 * pfVar46[6] + auVar237._24_4_;
          auVar91._28_4_ = fVar277 + auVar237._28_4_;
          auVar237 = ZEXT3264(auVar91);
          pfVar43 = (float *)((long)pvVar48 + lVar61 + lVar50);
          in_ZMM6 = ZEXT3264(CONCAT428(pfVar51[7] + in_ZMM6._28_4_,
                                       CONCAT424(fVar146 * pfVar43[6] + in_ZMM6._24_4_,
                                                 CONCAT420(fVar145 * pfVar43[5] + in_ZMM6._20_4_,
                                                           CONCAT416(fVar144 * pfVar43[4] +
                                                                     in_ZMM6._16_4_,
                                                                     CONCAT412(fVar143 * pfVar43[3]
                                                                               + in_ZMM6._12_4_,
                                                                               CONCAT48(fVar142 * 
                                                  pfVar43[2] + in_ZMM6._8_4_,
                                                  CONCAT44(fVar141 * pfVar43[1] + in_ZMM6._4_4_,
                                                           fVar100 * *pfVar43 + in_ZMM6._0_4_)))))))
                            );
          iVar42 = iVar42 + 8;
          lVar61 = lVar61 + 0x20;
        } while (iVar42 < (int)uVar62);
        lVar8 = lVar61 + lVar50;
        lVar7 = lVar61 + lVar55;
        lVar6 = lVar61 + lVar57;
        lVar5 = lVar61 + lVar60;
        lVar4 = lVar61 + local_b8;
        lVar3 = lVar61 + lVar49;
        lVar2 = lVar61 + local_b0;
        lVar1 = lVar61 + local_c0;
        pfVar51 = (float *)((long)local_138 + lVar61);
        uVar59 = uVar62 & 0xfffffff8;
      }
      if (uVar62 - uVar59 != 0 && (int)uVar59 <= (int)uVar62) {
        lVar61 = 0;
        do {
          auVar184 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar48 + lVar61 * 4 + lVar5)),
                                   ZEXT416(*(uint *)((long)pvVar48 + lVar61 * 4 + lVar6)),0x10);
          auVar184 = vinsertps_avx(auVar184,ZEXT416(*(uint *)((long)pvVar48 + lVar61 * 4 + lVar7)),
                                   0x20);
          auVar184 = vinsertps_avx(auVar184,ZEXT416(*(uint *)((long)pvVar48 + lVar61 * 4 + lVar8)),
                                   0x30);
          auVar227 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar48 + lVar61 * 4 + lVar1)),
                                   ZEXT416(*(uint *)((long)pvVar48 + lVar61 * 4 + lVar2)),0x10);
          auVar227 = vinsertps_avx(auVar227,ZEXT416(*(uint *)((long)pvVar48 + lVar61 * 4 + lVar3)),
                                   0x20);
          auVar227 = vinsertps_avx(auVar227,ZEXT416(*(uint *)((long)pvVar48 + lVar61 * 4 + lVar4)),
                                   0x30);
          fVar100 = pfVar51[lVar61];
          in_ZMM11 = ZEXT3264(CONCAT428(fVar100,CONCAT424(fVar100,CONCAT420(fVar100,CONCAT416(
                                                  fVar100,CONCAT412(fVar100,CONCAT48(fVar100,
                                                  CONCAT44(fVar100,fVar100))))))));
          fVar267 = auVar227._0_4_ * fVar100 + fVar267;
          fVar270 = auVar227._4_4_ * fVar100 + fVar270;
          fVar271 = auVar227._8_4_ * fVar100 + fVar271;
          fVar272 = auVar227._12_4_ * fVar100 + fVar272;
          fVar273 = auVar184._0_4_ * fVar100 + fVar273;
          fVar274 = auVar184._4_4_ * fVar100 + fVar274;
          fVar275 = auVar184._8_4_ * fVar100 + fVar275;
          fVar276 = auVar184._12_4_ + fVar276;
          lVar61 = lVar61 + 1;
        } while (uVar62 - uVar59 != (int)lVar61);
      }
      auVar90 = vhaddps_avx(auVar278,auVar249);
      auVar243 = vhaddps_avx(auVar244,auVar234);
      auVar243 = vhaddps_avx(auVar90,auVar243);
      in_ZMM7 = ZEXT3264(auVar243);
      auVar90 = vhaddps_avx(auVar171,auVar125);
      auVar248 = vhaddps_avx(auVar91,in_ZMM6._0_32_);
      auVar248 = vhaddps_avx(auVar90,auVar248);
      auVar90 = vblendps_avx(auVar243,auVar248,0xf0);
      auVar243 = vperm2f128_avx(auVar243,auVar248,0x21);
      auVar266._0_4_ = fVar267 + auVar243._0_4_ + auVar90._0_4_;
      auVar266._4_4_ = fVar270 + auVar243._4_4_ + auVar90._4_4_;
      auVar266._8_4_ = fVar271 + auVar243._8_4_ + auVar90._8_4_;
      auVar266._12_4_ = fVar272 + auVar243._12_4_ + auVar90._12_4_;
      auVar266._16_4_ = fVar273 + auVar243._16_4_ + auVar90._16_4_;
      auVar266._20_4_ = fVar274 + auVar243._20_4_ + auVar90._20_4_;
      auVar266._24_4_ = fVar275 + auVar243._24_4_ + auVar90._24_4_;
      auVar266._28_4_ = fVar276 + auVar243._28_4_ + auVar90._28_4_;
      auVar248 = auVar226._0_32_;
      auVar243 = auVar99._0_32_;
      fVar267 = auVar99._0_4_;
      fVar270 = auVar99._4_4_;
      fVar271 = auVar99._8_4_;
      fVar272 = auVar99._12_4_;
      fVar273 = auVar99._16_4_;
      fVar274 = auVar99._20_4_;
      fVar275 = auVar99._24_4_;
      fVar276 = auVar99._28_4_;
      switch(uVar44) {
      case 1:
        auVar266 = vmaxps_avx(auVar266,auVar248);
        break;
      case 2:
        auVar28 = vmaxps_avx(auVar266,auVar248);
        auVar90 = vminps_avx(auVar266,auVar248);
        fVar267 = **(float **)(&this->field_0xe8 + (long)p_Var24);
        auVar30._4_4_ = fVar267 * auVar90._4_4_;
        auVar30._0_4_ = fVar267 * auVar90._0_4_;
        auVar30._8_4_ = fVar267 * auVar90._8_4_;
        auVar30._12_4_ = fVar267 * auVar90._12_4_;
        auVar30._16_4_ = fVar267 * auVar90._16_4_;
        auVar30._20_4_ = fVar267 * auVar90._20_4_;
        auVar30._24_4_ = fVar267 * auVar90._24_4_;
        auVar30._28_4_ = auVar90._28_4_;
        goto LAB_002ffc9a;
      case 3:
        uVar13 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var24);
        auVar94._4_4_ = uVar13;
        auVar94._0_4_ = uVar13;
        auVar94._8_4_ = uVar13;
        auVar94._12_4_ = uVar13;
        auVar94._16_4_ = uVar13;
        auVar94._20_4_ = uVar13;
        auVar94._24_4_ = uVar13;
        auVar94._28_4_ = uVar13;
        uVar13 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var24))[1];
        auVar134._4_4_ = uVar13;
        auVar134._0_4_ = uVar13;
        auVar134._8_4_ = uVar13;
        auVar134._12_4_ = uVar13;
        auVar134._16_4_ = uVar13;
        auVar134._20_4_ = uVar13;
        auVar134._24_4_ = uVar13;
        auVar134._28_4_ = uVar13;
        auVar90 = vmaxps_avx(auVar266,auVar94);
        auVar266 = vminps_avx(auVar90,auVar134);
        break;
      case 4:
        uVar52 = CONCAT44(auVar266._4_4_,auVar266._0_4_);
        auVar95._0_8_ = uVar52 ^ 0x8000000080000000;
        auVar95._8_4_ = -auVar266._8_4_;
        auVar95._12_4_ = -auVar266._12_4_;
        auVar95._16_4_ = -auVar266._16_4_;
        auVar95._20_4_ = -auVar266._20_4_;
        auVar95._24_4_ = -auVar266._24_4_;
        auVar95._28_4_ = -auVar266._28_4_;
        auVar135._8_4_ = 0x42b0c0a5;
        auVar135._0_8_ = 0x42b0c0a542b0c0a5;
        auVar135._12_4_ = 0x42b0c0a5;
        auVar135._16_4_ = 0x42b0c0a5;
        auVar135._20_4_ = 0x42b0c0a5;
        auVar135._24_4_ = 0x42b0c0a5;
        auVar135._28_4_ = 0x42b0c0a5;
        auVar90 = vminps_avx(auVar95,auVar135);
        auVar136._8_4_ = 0xc2b0c0a5;
        auVar136._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar136._12_4_ = 0xc2b0c0a5;
        auVar136._16_4_ = 0xc2b0c0a5;
        auVar136._20_4_ = 0xc2b0c0a5;
        auVar136._24_4_ = 0xc2b0c0a5;
        auVar136._28_4_ = 0xc2b0c0a5;
        auVar248 = vmaxps_avx(auVar90,auVar136);
        auVar137._0_4_ = auVar248._0_4_ * 1.442695 + 0.5;
        auVar137._4_4_ = auVar248._4_4_ * 1.442695 + 0.5;
        auVar137._8_4_ = auVar248._8_4_ * 1.442695 + 0.5;
        auVar137._12_4_ = auVar248._12_4_ * 1.442695 + 0.5;
        auVar137._16_4_ = auVar248._16_4_ * 1.442695 + 0.5;
        auVar137._20_4_ = auVar248._20_4_ * 1.442695 + 0.5;
        auVar137._24_4_ = auVar248._24_4_ * 1.442695 + 0.5;
        auVar137._28_4_ = 0x3ff8aa3b;
        auVar122 = vroundps_avx(auVar137,1);
        auVar90 = vcmpps_avx(auVar137,auVar122,1);
        auVar90 = vandps_avx(auVar90,auVar243);
        auVar90 = vsubps_avx(auVar122,auVar90);
        fVar100 = auVar248._0_4_ + auVar90._0_4_ * -0.6931472;
        fVar141 = auVar248._4_4_ + auVar90._4_4_ * -0.6931472;
        fVar142 = auVar248._8_4_ + auVar90._8_4_ * -0.6931472;
        fVar143 = auVar248._12_4_ + auVar90._12_4_ * -0.6931472;
        fVar144 = auVar248._16_4_ + auVar90._16_4_ * -0.6931472;
        fVar145 = auVar248._20_4_ + auVar90._20_4_ * -0.6931472;
        fVar146 = auVar248._24_4_ + auVar90._24_4_ * -0.6931472;
        in_ZMM7 = ZEXT3264(CONCAT428(0x3c088908,
                                     CONCAT424(0x3c088908,
                                               CONCAT420(0x3c088908,
                                                         CONCAT416(0x3c088908,
                                                                   CONCAT412(0x3c088908,
                                                                             CONCAT48(0x3c088908,
                                                                                                                                                                            
                                                  0x3c0889083c088908)))))));
        fVar147 = ((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) * fVar100 +
                   0.041665796) * fVar100 + 0.16666666) * fVar100 + 0.5;
        fVar277 = ((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                   0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5;
        fVar280 = ((((fVar142 * 0.00019875691 + 0.0013981999) * fVar142 + 0.008333452) * fVar142 +
                   0.041665796) * fVar142 + 0.16666666) * fVar142 + 0.5;
        fVar281 = ((((fVar143 * 0.00019875691 + 0.0013981999) * fVar143 + 0.008333452) * fVar143 +
                   0.041665796) * fVar143 + 0.16666666) * fVar143 + 0.5;
        fVar282 = ((((fVar144 * 0.00019875691 + 0.0013981999) * fVar144 + 0.008333452) * fVar144 +
                   0.041665796) * fVar144 + 0.16666666) * fVar144 + 0.5;
        fVar283 = ((((fVar145 * 0.00019875691 + 0.0013981999) * fVar145 + 0.008333452) * fVar145 +
                   0.041665796) * fVar145 + 0.16666666) * fVar145 + 0.5;
        fVar284 = ((((fVar146 * 0.00019875691 + 0.0013981999) * fVar146 + 0.008333452) * fVar146 +
                   0.041665796) * fVar146 + 0.16666666) * fVar146 + 0.5;
        in_ZMM6 = ZEXT3264(CONCAT428(0x3f37e013,
                                     CONCAT424(fVar284,CONCAT420(fVar283,CONCAT416(fVar282,CONCAT412
                                                  (fVar281,CONCAT48(fVar280,CONCAT44(fVar277,fVar147
                                                                                    ))))))));
        auVar110._0_4_ = (int)auVar90._0_4_;
        auVar110._4_4_ = (int)auVar90._4_4_;
        auVar110._8_4_ = (int)auVar90._8_4_;
        auVar110._12_4_ = (int)auVar90._12_4_;
        auVar138._16_4_ = (int)auVar90._16_4_;
        auVar138._0_16_ = auVar110;
        auVar138._20_4_ = (int)auVar90._20_4_;
        auVar138._24_4_ = (int)auVar90._24_4_;
        auVar138._28_4_ = (int)auVar90._28_4_;
        auVar227 = vpslld_avx(auVar110,0x17);
        auVar184 = vpslld_avx(auVar138._16_16_,0x17);
        auVar64._8_4_ = 0x3f800000;
        auVar64._0_8_ = 0x3f8000003f800000;
        auVar64._12_4_ = 0x3f800000;
        auVar184 = vpaddd_avx(auVar184,auVar64);
        auVar227 = vpaddd_avx(auVar227,auVar64);
        auVar96._0_4_ = (fVar100 + fVar267 + fVar100 * fVar100 * fVar147) * auVar227._0_4_ + fVar267
        ;
        auVar96._4_4_ = (fVar141 + fVar270 + fVar141 * fVar141 * fVar277) * auVar227._4_4_ + fVar270
        ;
        auVar96._8_4_ = (fVar142 + fVar271 + fVar142 * fVar142 * fVar280) * auVar227._8_4_ + fVar271
        ;
        auVar96._12_4_ =
             (fVar143 + fVar272 + fVar143 * fVar143 * fVar281) * auVar227._12_4_ + fVar272;
        auVar96._16_4_ =
             (fVar144 + fVar273 + fVar144 * fVar144 * fVar282) * auVar184._0_4_ + fVar273;
        auVar96._20_4_ =
             (fVar145 + fVar274 + fVar145 * fVar145 * fVar283) * auVar184._4_4_ + fVar274;
        auVar96._24_4_ =
             (fVar146 + fVar275 + fVar146 * fVar146 * fVar284) * auVar184._8_4_ + fVar275;
        auVar96._28_4_ = auVar248._28_4_ + -0.6931472 + fVar276 + -0.6931472 + fVar276;
        auVar30 = vrcpps_avx(auVar96);
        auVar40._4_4_ = auVar96._4_4_ * auVar30._4_4_;
        auVar40._0_4_ = auVar96._0_4_ * auVar30._0_4_;
        auVar40._8_4_ = auVar96._8_4_ * auVar30._8_4_;
        auVar40._12_4_ = auVar96._12_4_ * auVar30._12_4_;
        auVar40._16_4_ = auVar96._16_4_ * auVar30._16_4_;
        auVar40._20_4_ = auVar96._20_4_ * auVar30._20_4_;
        auVar40._24_4_ = auVar96._24_4_ * auVar30._24_4_;
        auVar40._28_4_ = auVar96._28_4_;
        auVar90 = vsubps_avx(auVar243,auVar40);
        auVar28._4_4_ = auVar30._4_4_ * auVar90._4_4_;
        auVar28._0_4_ = auVar30._0_4_ * auVar90._0_4_;
        auVar28._8_4_ = auVar30._8_4_ * auVar90._8_4_;
        auVar28._12_4_ = auVar30._12_4_ * auVar90._12_4_;
        auVar28._16_4_ = auVar30._16_4_ * auVar90._16_4_;
        auVar28._20_4_ = auVar30._20_4_ * auVar90._20_4_;
        auVar28._24_4_ = auVar30._24_4_ * auVar90._24_4_;
        auVar28._28_4_ = auVar90._28_4_;
LAB_002ffc9a:
        auVar266._0_4_ = auVar30._0_4_ + auVar28._0_4_;
        auVar266._4_4_ = auVar30._4_4_ + auVar28._4_4_;
        auVar266._8_4_ = auVar30._8_4_ + auVar28._8_4_;
        auVar266._12_4_ = auVar30._12_4_ + auVar28._12_4_;
        auVar266._16_4_ = auVar30._16_4_ + auVar28._16_4_;
        auVar266._20_4_ = auVar30._20_4_ + auVar28._20_4_;
        auVar266._24_4_ = auVar30._24_4_ + auVar28._24_4_;
        auVar266._28_4_ = auVar30._28_4_ + auVar28._28_4_;
        break;
      case 5:
        auVar250._8_4_ = 0x42b0c0a5;
        auVar250._0_8_ = 0x42b0c0a542b0c0a5;
        auVar250._12_4_ = 0x42b0c0a5;
        auVar250._16_4_ = 0x42b0c0a5;
        auVar250._20_4_ = 0x42b0c0a5;
        auVar250._24_4_ = 0x42b0c0a5;
        auVar250._28_4_ = 0x42b0c0a5;
        auVar248 = vminps_avx(auVar266,auVar250);
        auVar255._8_4_ = 0xc2b0c0a5;
        auVar255._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar255._12_4_ = 0xc2b0c0a5;
        auVar255._16_4_ = 0xc2b0c0a5;
        auVar255._20_4_ = 0xc2b0c0a5;
        auVar255._24_4_ = 0xc2b0c0a5;
        auVar255._28_4_ = 0xc2b0c0a5;
        auVar248 = vmaxps_avx(auVar255,auVar248);
        in_ZMM11 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar205._8_4_ = 0x3f000000;
        auVar205._0_8_ = 0x3f0000003f000000;
        auVar205._12_4_ = 0x3f000000;
        auVar205._16_4_ = 0x3f000000;
        auVar205._20_4_ = 0x3f000000;
        auVar205._24_4_ = 0x3f000000;
        auVar205._28_4_ = 0x3f000000;
        auVar126._0_4_ = auVar248._0_4_ * 1.442695 + 0.5;
        auVar126._4_4_ = auVar248._4_4_ * 1.442695 + 0.5;
        auVar126._8_4_ = auVar248._8_4_ * 1.442695 + 0.5;
        auVar126._12_4_ = auVar248._12_4_ * 1.442695 + 0.5;
        auVar126._16_4_ = auVar248._16_4_ * 1.442695 + 0.5;
        auVar126._20_4_ = auVar248._20_4_ * 1.442695 + 0.5;
        auVar126._24_4_ = auVar248._24_4_ * 1.442695 + 0.5;
        auVar126._28_4_ = auVar90._28_4_ + 0.5;
        auVar122 = vroundps_avx(auVar126,1);
        auVar90 = vcmpps_avx(auVar126,auVar122,1);
        auVar90 = vandps_avx(auVar90,auVar243);
        auVar90 = vsubps_avx(auVar122,auVar90);
        auVar36._4_4_ = auVar90._4_4_ * 0.6931472;
        auVar36._0_4_ = auVar90._0_4_ * 0.6931472;
        auVar36._8_4_ = auVar90._8_4_ * 0.6931472;
        auVar36._12_4_ = auVar90._12_4_ * 0.6931472;
        auVar36._16_4_ = auVar90._16_4_ * 0.6931472;
        auVar36._20_4_ = auVar90._20_4_ * 0.6931472;
        auVar36._24_4_ = auVar90._24_4_ * 0.6931472;
        auVar36._28_4_ = auVar122._28_4_;
        auVar248 = vsubps_avx(auVar248,auVar36);
        fVar100 = auVar248._0_4_;
        fVar141 = auVar248._4_4_;
        fVar142 = auVar248._8_4_;
        fVar143 = auVar248._12_4_;
        fVar144 = auVar248._16_4_;
        fVar145 = auVar248._20_4_;
        fVar146 = auVar248._24_4_;
        in_ZMM12 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        auVar108._0_4_ = (int)auVar90._0_4_;
        auVar108._4_4_ = (int)auVar90._4_4_;
        auVar108._8_4_ = (int)auVar90._8_4_;
        auVar108._12_4_ = (int)auVar90._12_4_;
        auVar127._16_4_ = (int)auVar90._16_4_;
        auVar127._0_16_ = auVar108;
        auVar127._20_4_ = (int)auVar90._20_4_;
        auVar127._24_4_ = (int)auVar90._24_4_;
        auVar127._28_4_ = (int)auVar90._28_4_;
        auVar227 = vpslld_avx(auVar108,0x17);
        auVar184 = vpslld_avx(auVar127._16_16_,0x17);
        auVar192._8_4_ = 0x3f800000;
        auVar192._0_8_ = 0x3f8000003f800000;
        auVar192._12_4_ = 0x3f800000;
        auVar184 = vpaddd_avx(auVar184,auVar192);
        auVar227 = vpaddd_avx(auVar227,auVar192);
        auVar92._0_4_ =
             (fVar100 + fVar267 +
             fVar100 * fVar100 *
             (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) * fVar100 +
               0.041665796) * fVar100 + 0.16666666) * fVar100 + 0.5)) * auVar227._0_4_ + fVar267;
        auVar92._4_4_ =
             (fVar141 + fVar270 +
             fVar141 * fVar141 *
             (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
               0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5)) * auVar227._4_4_ + fVar270;
        auVar92._8_4_ =
             (fVar142 + fVar271 +
             fVar142 * fVar142 *
             (((((fVar142 * 0.00019875691 + 0.0013981999) * fVar142 + 0.008333452) * fVar142 +
               0.041665796) * fVar142 + 0.16666666) * fVar142 + 0.5)) * auVar227._8_4_ + fVar271;
        auVar92._12_4_ =
             (fVar143 + fVar272 +
             fVar143 * fVar143 *
             (((((fVar143 * 0.00019875691 + 0.0013981999) * fVar143 + 0.008333452) * fVar143 +
               0.041665796) * fVar143 + 0.16666666) * fVar143 + 0.5)) * auVar227._12_4_ + fVar272;
        auVar92._16_4_ =
             (fVar144 + fVar273 +
             fVar144 * fVar144 *
             (((((fVar144 * 0.00019875691 + 0.0013981999) * fVar144 + 0.008333452) * fVar144 +
               0.041665796) * fVar144 + 0.16666666) * fVar144 + 0.5)) * auVar184._0_4_ + fVar273;
        auVar92._20_4_ =
             (fVar145 + fVar274 +
             fVar145 * fVar145 *
             (((((fVar145 * 0.00019875691 + 0.0013981999) * fVar145 + 0.008333452) * fVar145 +
               0.041665796) * fVar145 + 0.16666666) * fVar145 + 0.5)) * auVar184._4_4_ + fVar274;
        auVar92._24_4_ =
             (fVar146 + fVar275 +
             fVar146 * fVar146 *
             (((((fVar146 * 0.00019875691 + 0.0013981999) * fVar146 + 0.008333452) * fVar146 +
               0.041665796) * fVar146 + 0.16666666) * fVar146 + 0.5)) * auVar184._8_4_ + fVar275;
        auVar92._28_4_ = auVar248._28_4_ + fVar276 + auVar122._28_4_ + fVar276;
        auVar128._8_4_ = 0x800000;
        auVar128._0_8_ = 0x80000000800000;
        auVar128._12_4_ = 0x800000;
        auVar128._16_4_ = 0x800000;
        auVar128._20_4_ = 0x800000;
        auVar128._24_4_ = 0x800000;
        auVar128._28_4_ = 0x800000;
        auVar122 = vmaxps_avx(auVar92,auVar128);
        auVar184 = vpsrld_avx(auVar122._16_16_,0x17);
        auVar129._8_4_ = 0x807fffff;
        auVar129._0_8_ = 0x807fffff807fffff;
        auVar129._12_4_ = 0x807fffff;
        auVar129._16_4_ = 0x807fffff;
        auVar129._20_4_ = 0x807fffff;
        auVar129._24_4_ = 0x807fffff;
        auVar129._28_4_ = 0x807fffff;
        auVar90 = vandps_avx(auVar122,auVar129);
        auVar170 = vorps_avx(auVar90,auVar205);
        auVar235._8_4_ = 0x3f3504f3;
        auVar235._0_8_ = 0x3f3504f33f3504f3;
        auVar235._12_4_ = 0x3f3504f3;
        auVar235._16_4_ = 0x3f3504f3;
        auVar235._20_4_ = 0x3f3504f3;
        auVar235._24_4_ = 0x3f3504f3;
        auVar235._28_4_ = 0x3f3504f3;
        auVar248 = vcmpps_avx(auVar235,auVar170,2);
        auVar90 = vandnps_avx(auVar248,auVar170);
        fVar100 = auVar90._0_4_ + auVar170._0_4_ + -1.0;
        fVar141 = auVar90._4_4_ + auVar170._4_4_ + -1.0;
        fVar142 = auVar90._8_4_ + auVar170._8_4_ + -1.0;
        fVar143 = auVar90._12_4_ + auVar170._12_4_ + -1.0;
        fVar144 = auVar90._16_4_ + auVar170._16_4_ + -1.0;
        fVar145 = auVar90._20_4_ + auVar170._20_4_ + -1.0;
        fVar146 = auVar90._24_4_ + auVar170._24_4_ + -1.0;
        auVar184 = vpsubd_avx(auVar184,auVar248._16_16_);
        auVar227 = vpsrld_avx(auVar122._0_16_,0x17);
        auVar239._8_4_ = 0xffffff81;
        auVar239._0_8_ = 0xffffff81ffffff81;
        auVar239._12_4_ = 0xffffff81;
        auVar184 = vpaddd_avx(auVar239,auVar184);
        auVar227 = vpsubd_avx(auVar227,auVar248._0_16_);
        auVar227 = vpaddd_avx(auVar239,auVar227);
        auVar172._16_16_ = auVar184;
        auVar172._0_16_ = auVar227;
        auVar248 = vcmpps_avx(auVar92,_DAT_00598560,2);
        auVar122 = vcvtdq2ps_avx(auVar172);
        auVar37._4_4_ =
             (auVar122._4_4_ * 0.6931472 + fVar141 +
             fVar141 * fVar141 *
             (((((((((fVar141 * 0.070376836 + -0.1151461) * fVar141 + 0.116769984) * fVar141 +
                   -0.12420141) * fVar141 + 0.14249323) * fVar141 + -0.16668057) * fVar141 +
                0.20000714) * fVar141 + -0.24999994) * fVar141 + 0.3333333) * fVar141 + -0.5)) *
             -2.0;
        auVar37._0_4_ =
             (auVar122._0_4_ * 0.6931472 + fVar100 +
             fVar100 * fVar100 *
             (((((((((fVar100 * 0.070376836 + -0.1151461) * fVar100 + 0.116769984) * fVar100 +
                   -0.12420141) * fVar100 + 0.14249323) * fVar100 + -0.16668057) * fVar100 +
                0.20000714) * fVar100 + -0.24999994) * fVar100 + 0.3333333) * fVar100 + -0.5)) *
             -2.0;
        auVar37._8_4_ =
             (auVar122._8_4_ * 0.6931472 + fVar142 +
             fVar142 * fVar142 *
             (((((((((fVar142 * 0.070376836 + -0.1151461) * fVar142 + 0.116769984) * fVar142 +
                   -0.12420141) * fVar142 + 0.14249323) * fVar142 + -0.16668057) * fVar142 +
                0.20000714) * fVar142 + -0.24999994) * fVar142 + 0.3333333) * fVar142 + -0.5)) *
             -2.0;
        auVar37._12_4_ =
             (auVar122._12_4_ * 0.6931472 + fVar143 +
             fVar143 * fVar143 *
             (((((((((fVar143 * 0.070376836 + -0.1151461) * fVar143 + 0.116769984) * fVar143 +
                   -0.12420141) * fVar143 + 0.14249323) * fVar143 + -0.16668057) * fVar143 +
                0.20000714) * fVar143 + -0.24999994) * fVar143 + 0.3333333) * fVar143 + -0.5)) *
             -2.0;
        auVar37._16_4_ =
             (auVar122._16_4_ * 0.6931472 + fVar144 +
             fVar144 * fVar144 *
             (((((((((fVar144 * 0.070376836 + -0.1151461) * fVar144 + 0.116769984) * fVar144 +
                   -0.12420141) * fVar144 + 0.14249323) * fVar144 + -0.16668057) * fVar144 +
                0.20000714) * fVar144 + -0.24999994) * fVar144 + 0.3333333) * fVar144 + -0.5)) *
             -2.0;
        auVar37._20_4_ =
             (auVar122._20_4_ * 0.6931472 + fVar145 +
             fVar145 * fVar145 *
             (((((((((fVar145 * 0.070376836 + -0.1151461) * fVar145 + 0.116769984) * fVar145 +
                   -0.12420141) * fVar145 + 0.14249323) * fVar145 + -0.16668057) * fVar145 +
                0.20000714) * fVar145 + -0.24999994) * fVar145 + 0.3333333) * fVar145 + -0.5)) *
             -2.0;
        auVar37._24_4_ =
             (auVar122._24_4_ * 0.6931472 + fVar146 +
             fVar146 * fVar146 *
             (((((((((fVar146 * 0.070376836 + -0.1151461) * fVar146 + 0.116769984) * fVar146 +
                   -0.12420141) * fVar146 + 0.14249323) * fVar146 + -0.16668057) * fVar146 +
                0.20000714) * fVar146 + -0.24999994) * fVar146 + 0.3333333) * fVar146 + -0.5)) *
             -2.0;
        auVar37._28_4_ = auVar122._28_4_ + auVar90._28_4_ + auVar170._28_4_ + -1.0 + 0.0;
        auVar173._8_4_ = 0x7fffffff;
        auVar173._0_8_ = 0x7fffffff7fffffff;
        auVar173._12_4_ = 0x7fffffff;
        auVar173._16_4_ = 0x7fffffff;
        auVar173._20_4_ = 0x7fffffff;
        auVar173._24_4_ = 0x7fffffff;
        auVar173._28_4_ = 0x7fffffff;
        auVar90 = vblendvps_avx(auVar37,auVar173,auVar248);
        auVar130._8_4_ = 0x42b0c0a5;
        auVar130._0_8_ = 0x42b0c0a542b0c0a5;
        auVar130._12_4_ = 0x42b0c0a5;
        auVar130._16_4_ = 0x42b0c0a5;
        auVar130._20_4_ = 0x42b0c0a5;
        auVar130._24_4_ = 0x42b0c0a5;
        auVar130._28_4_ = 0x42b0c0a5;
        auVar90 = vminps_avx(auVar90,auVar130);
        auVar131._8_4_ = 0xc2b0c0a5;
        auVar131._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar131._12_4_ = 0xc2b0c0a5;
        auVar131._16_4_ = 0xc2b0c0a5;
        auVar131._20_4_ = 0xc2b0c0a5;
        auVar131._24_4_ = 0xc2b0c0a5;
        auVar131._28_4_ = 0xc2b0c0a5;
        auVar248 = vmaxps_avx(auVar90,auVar131);
        auVar132._0_4_ = auVar248._0_4_ * 1.442695 + 0.5;
        auVar132._4_4_ = auVar248._4_4_ * 1.442695 + 0.5;
        auVar132._8_4_ = auVar248._8_4_ * 1.442695 + 0.5;
        auVar132._12_4_ = auVar248._12_4_ * 1.442695 + 0.5;
        auVar132._16_4_ = auVar248._16_4_ * 1.442695 + 0.5;
        auVar132._20_4_ = auVar248._20_4_ * 1.442695 + 0.5;
        auVar132._24_4_ = auVar248._24_4_ * 1.442695 + 0.5;
        auVar132._28_4_ = 0xc2afc0a5;
        auVar122 = vroundps_avx(auVar132,1);
        auVar90 = vcmpps_avx(auVar132,auVar122,1);
        auVar90 = vandps_avx(auVar90,auVar243);
        auVar90 = vsubps_avx(auVar122,auVar90);
        auVar38._4_4_ = auVar90._4_4_ * 0.6931472;
        auVar38._0_4_ = auVar90._0_4_ * 0.6931472;
        auVar38._8_4_ = auVar90._8_4_ * 0.6931472;
        auVar38._12_4_ = auVar90._12_4_ * 0.6931472;
        auVar38._16_4_ = auVar90._16_4_ * 0.6931472;
        auVar38._20_4_ = auVar90._20_4_ * 0.6931472;
        auVar38._24_4_ = auVar90._24_4_ * 0.6931472;
        auVar38._28_4_ = auVar122._28_4_;
        auVar248 = vsubps_avx(auVar248,auVar38);
        fVar100 = auVar248._0_4_;
        fVar141 = auVar248._4_4_;
        fVar142 = auVar248._8_4_;
        fVar143 = auVar248._12_4_;
        fVar144 = auVar248._16_4_;
        fVar145 = auVar248._20_4_;
        fVar146 = auVar248._24_4_;
        auVar226 = ZEXT864(0) << 0x20;
        in_ZMM7 = ZEXT3264(auVar205);
        auVar99 = ZEXT3264(auVar243);
        fVar147 = ((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) * fVar100 +
                   0.041665796) * fVar100 + 0.16666666) * fVar100 + 0.5;
        fVar277 = ((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                   0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5;
        fVar280 = ((((fVar142 * 0.00019875691 + 0.0013981999) * fVar142 + 0.008333452) * fVar142 +
                   0.041665796) * fVar142 + 0.16666666) * fVar142 + 0.5;
        fVar281 = ((((fVar143 * 0.00019875691 + 0.0013981999) * fVar143 + 0.008333452) * fVar143 +
                   0.041665796) * fVar143 + 0.16666666) * fVar143 + 0.5;
        fVar282 = ((((fVar144 * 0.00019875691 + 0.0013981999) * fVar144 + 0.008333452) * fVar144 +
                   0.041665796) * fVar144 + 0.16666666) * fVar144 + 0.5;
        fVar283 = ((((fVar145 * 0.00019875691 + 0.0013981999) * fVar145 + 0.008333452) * fVar145 +
                   0.041665796) * fVar145 + 0.16666666) * fVar145 + 0.5;
        fVar284 = ((((fVar146 * 0.00019875691 + 0.0013981999) * fVar146 + 0.008333452) * fVar146 +
                   0.041665796) * fVar146 + 0.16666666) * fVar146 + 0.5;
        in_ZMM6 = ZEXT3264(CONCAT428(0x3f37d30c,
                                     CONCAT424(fVar284,CONCAT420(fVar283,CONCAT416(fVar282,CONCAT412
                                                  (fVar281,CONCAT48(fVar280,CONCAT44(fVar277,fVar147
                                                                                    ))))))));
        auVar109._0_4_ = (int)auVar90._0_4_;
        auVar109._4_4_ = (int)auVar90._4_4_;
        auVar109._8_4_ = (int)auVar90._8_4_;
        auVar109._12_4_ = (int)auVar90._12_4_;
        auVar133._16_4_ = (int)auVar90._16_4_;
        auVar133._0_16_ = auVar109;
        auVar133._20_4_ = (int)auVar90._20_4_;
        auVar133._24_4_ = (int)auVar90._24_4_;
        auVar133._28_4_ = (int)auVar90._28_4_;
        auVar227 = vpslld_avx(auVar109,0x17);
        auVar184 = vpslld_avx(auVar133._16_16_,0x17);
        auVar184 = vpaddd_avx(auVar184,auVar192);
        auVar227 = vpaddd_avx(auVar227,auVar192);
        auVar93._0_4_ = (fVar100 + fVar267 + fVar100 * fVar100 * fVar147) * auVar227._0_4_ + fVar267
        ;
        auVar93._4_4_ = (fVar141 + fVar270 + fVar141 * fVar141 * fVar277) * auVar227._4_4_ + fVar270
        ;
        auVar93._8_4_ = (fVar142 + fVar271 + fVar142 * fVar142 * fVar280) * auVar227._8_4_ + fVar271
        ;
        auVar93._12_4_ =
             (fVar143 + fVar272 + fVar143 * fVar143 * fVar281) * auVar227._12_4_ + fVar272;
        auVar93._16_4_ =
             (fVar144 + fVar273 + fVar144 * fVar144 * fVar282) * auVar184._0_4_ + fVar273;
        auVar93._20_4_ =
             (fVar145 + fVar274 + fVar145 * fVar145 * fVar283) * auVar184._4_4_ + fVar274;
        auVar93._24_4_ =
             (fVar146 + fVar275 + fVar146 * fVar146 * fVar284) * auVar184._8_4_ + fVar275;
        auVar93._28_4_ = auVar248._28_4_ + fVar276 + auVar122._28_4_ + fVar276;
        auVar90 = vrcpps_avx(auVar93);
        fVar267 = auVar90._0_4_;
        fVar270 = auVar90._4_4_;
        fVar271 = auVar90._8_4_;
        fVar272 = auVar90._12_4_;
        fVar273 = auVar90._16_4_;
        fVar274 = auVar90._20_4_;
        fVar275 = auVar90._24_4_;
        auVar39._4_4_ = auVar93._4_4_ * (fVar270 + fVar270);
        auVar39._0_4_ = auVar93._0_4_ * (fVar267 + fVar267);
        auVar39._8_4_ = auVar93._8_4_ * (fVar271 + fVar271);
        auVar39._12_4_ = auVar93._12_4_ * (fVar272 + fVar272);
        auVar39._16_4_ = auVar93._16_4_ * (fVar273 + fVar273);
        auVar39._20_4_ = auVar93._20_4_ * (fVar274 + fVar274);
        auVar39._24_4_ = auVar93._24_4_ * (fVar275 + fVar275);
        auVar39._28_4_ = auVar93._28_4_;
        auVar71._8_4_ = 0x40000000;
        auVar71._0_8_ = 0x4000000040000000;
        auVar71._12_4_ = 0x40000000;
        auVar71._16_4_ = 0x40000000;
        auVar71._20_4_ = 0x40000000;
        auVar71._24_4_ = 0x40000000;
        auVar71._28_4_ = 0x40000000;
        auVar90 = vsubps_avx(auVar71,auVar39);
        auVar89._0_4_ = fVar267 + fVar267 + -1.0 + fVar267 * auVar90._0_4_;
        auVar89._4_4_ = fVar270 + fVar270 + -1.0 + fVar270 * auVar90._4_4_;
        auVar89._8_4_ = fVar271 + fVar271 + -1.0 + fVar271 * auVar90._8_4_;
        auVar89._12_4_ = fVar272 + fVar272 + -1.0 + fVar272 * auVar90._12_4_;
        auVar89._16_4_ = fVar273 + fVar273 + -1.0 + fVar273 * auVar90._16_4_;
        auVar89._20_4_ = fVar274 + fVar274 + -1.0 + fVar274 * auVar90._20_4_;
        auVar89._24_4_ = fVar275 + fVar275 + -1.0 + fVar275 * auVar90._24_4_;
        goto LAB_002ffcc8;
      case 6:
        fVar267 = **(float **)(&this->field_0xe8 + (long)p_Var24);
        fVar270 = (*(float **)(&this->field_0xe8 + (long)p_Var24))[1];
        auVar97._0_4_ = auVar266._0_4_ * fVar267 + fVar270;
        auVar97._4_4_ = auVar266._4_4_ * fVar267 + fVar270;
        auVar97._8_4_ = auVar266._8_4_ * fVar267 + fVar270;
        auVar97._12_4_ = auVar266._12_4_ * fVar267 + fVar270;
        auVar97._16_4_ = auVar266._16_4_ * fVar267 + fVar270;
        auVar97._20_4_ = auVar266._20_4_ * fVar267 + fVar270;
        auVar97._24_4_ = auVar266._24_4_ * fVar267 + fVar270;
        auVar97._28_4_ = fVar267 + fVar270;
        auVar90 = vmaxps_avx(auVar248,auVar97);
        auVar90 = vminps_avx(auVar90,auVar243);
        auVar89 = auVar90._0_28_;
LAB_002ffcc8:
        auVar266._4_4_ = auVar266._4_4_ * auVar89._4_4_;
        auVar266._0_4_ = auVar266._0_4_ * auVar89._0_4_;
        auVar266._8_4_ = auVar266._8_4_ * auVar89._8_4_;
        auVar266._12_4_ = auVar266._12_4_ * auVar89._12_4_;
        auVar266._16_4_ = auVar266._16_4_ * auVar89._16_4_;
        auVar266._20_4_ = auVar266._20_4_ * auVar89._20_4_;
        auVar266._24_4_ = auVar266._24_4_ * auVar89._24_4_;
      }
      auVar263 = in_ZMM12._0_16_;
      *(undefined1 (*) [32])((long)top_blob->data + uVar45 * 0x20) = auVar266;
      uVar45 = uVar45 + 1;
      lVar50 = lVar50 + local_98;
      lVar55 = lVar55 + local_98;
      lVar57 = lVar57 + local_98;
      lVar60 = lVar60 + local_98;
      local_b8 = local_b8 + local_98;
      lVar49 = lVar49 + local_98;
      local_b0 = local_b0 + local_98;
      local_c0 = local_c0 + local_98;
      local_c8 = top_blob;
      local_a8 = this;
      local_88 = (ulong)uVar44;
    } while (uVar45 != local_90);
  }
  uVar45 = local_d0 & 0xfffffffffffffff8;
  if ((uVar47 >> 2 & 1) == 0) goto LAB_0030041c;
  if (lVar26 == 0) {
    fVar267 = 0.0;
    fVar270 = 0.0;
    fVar271 = 0.0;
    fVar272 = 0.0;
  }
  else {
    pfVar51 = (float *)(lVar26 + uVar45 * 4);
    fVar267 = *pfVar51;
    fVar270 = pfVar51[1];
    fVar271 = pfVar51[2];
    fVar272 = pfVar51[3];
  }
  pvVar27 = (this->weight_data_tm).data;
  pvVar48 = (void *)((long)pvVar27 + uVar45 * lVar56 * 4);
  if ((int)uVar62 < 8) {
    uVar59 = 0;
    lVar49 = (uVar45 | 1) * lVar56 * 4;
    lVar57 = (uVar45 | 2) * lVar56 * 4;
    lVar50 = (uVar45 | 3) * lVar56 * 4;
    auVar139 = ZEXT832(0);
    auVar206 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar174 = ZEXT832(0);
    auVar98 = ZEXT832(0);
    pfVar51 = local_138;
  }
  else {
    uVar59 = uVar62 & 0xfffffff8;
    lVar49 = (uVar45 + 3) * lVar56;
    lVar57 = (uVar45 + 2) * lVar56;
    lVar55 = (uVar45 + 1) * lVar56;
    auVar99 = ZEXT864(0);
    iVar42 = 7;
    lVar60 = 0;
    auVar237 = ZEXT864(0);
    auVar245 = ZEXT1664((undefined1  [16])0x0);
    auVar226 = ZEXT864(0);
    do {
      pfVar51 = (float *)((long)local_138 + lVar60);
      fVar273 = *pfVar51;
      fVar274 = pfVar51[1];
      fVar275 = pfVar51[2];
      fVar276 = pfVar51[3];
      fVar100 = pfVar51[4];
      fVar141 = pfVar51[5];
      fVar142 = pfVar51[6];
      pfVar43 = (float *)((long)pvVar48 + lVar60);
      auVar139._0_4_ = fVar273 * *pfVar43 + auVar226._0_4_;
      auVar139._4_4_ = fVar274 * pfVar43[1] + auVar226._4_4_;
      auVar139._8_4_ = fVar275 * pfVar43[2] + auVar226._8_4_;
      auVar139._12_4_ = fVar276 * pfVar43[3] + auVar226._12_4_;
      auVar139._16_4_ = fVar100 * pfVar43[4] + auVar226._16_4_;
      auVar139._20_4_ = fVar141 * pfVar43[5] + auVar226._20_4_;
      auVar139._24_4_ = fVar142 * pfVar43[6] + auVar226._24_4_;
      fVar143 = in_ZMM6._28_4_;
      auVar139._28_4_ = fVar143 + auVar226._28_4_;
      auVar226 = ZEXT3264(auVar139);
      pfVar43 = (float *)((long)pvVar27 + lVar60 + lVar55 * 4);
      in_ZMM6 = ZEXT3264(CONCAT428(fVar143,CONCAT424(fVar142 * pfVar43[6],
                                                     CONCAT420(fVar141 * pfVar43[5],
                                                               CONCAT416(fVar100 * pfVar43[4],
                                                                         CONCAT412(fVar276 * pfVar43
                                                  [3],CONCAT48(fVar275 * pfVar43[2],
                                                               CONCAT44(fVar274 * pfVar43[1],
                                                                        fVar273 * *pfVar43))))))));
      pfVar46 = (float *)((long)pvVar27 + lVar60 + lVar57 * 4);
      auVar251._0_4_ = fVar273 * *pfVar46;
      auVar251._4_4_ = fVar274 * pfVar46[1];
      auVar251._8_4_ = fVar275 * pfVar46[2];
      auVar251._12_4_ = fVar276 * pfVar46[3];
      auVar251._16_4_ = fVar100 * pfVar46[4];
      auVar251._20_4_ = fVar141 * pfVar46[5];
      auVar251._28_36_ = in_ZMM7._28_36_;
      auVar251._24_4_ = fVar142 * pfVar46[6];
      auVar206._0_4_ = fVar273 * *pfVar43 + auVar245._0_4_;
      auVar206._4_4_ = fVar274 * pfVar43[1] + auVar245._4_4_;
      auVar206._8_4_ = fVar275 * pfVar43[2] + auVar245._8_4_;
      auVar206._12_4_ = fVar276 * pfVar43[3] + auVar245._12_4_;
      auVar206._16_4_ = fVar100 * pfVar43[4] + auVar245._16_4_;
      auVar206._20_4_ = fVar141 * pfVar43[5] + auVar245._20_4_;
      auVar206._24_4_ = fVar142 * pfVar43[6] + auVar245._24_4_;
      auVar206._28_4_ = fVar143 + auVar245._28_4_;
      auVar245 = ZEXT3264(auVar206);
      auVar174._0_4_ = auVar251._0_4_ + auVar237._0_4_;
      auVar174._4_4_ = auVar251._4_4_ + auVar237._4_4_;
      auVar174._8_4_ = auVar251._8_4_ + auVar237._8_4_;
      auVar174._12_4_ = auVar251._12_4_ + auVar237._12_4_;
      auVar174._16_4_ = auVar251._16_4_ + auVar237._16_4_;
      auVar174._20_4_ = auVar251._20_4_ + auVar237._20_4_;
      auVar174._24_4_ = auVar251._24_4_ + auVar237._24_4_;
      auVar174._28_4_ = in_ZMM7._28_4_ + auVar237._28_4_;
      auVar237 = ZEXT3264(auVar174);
      pfVar43 = (float *)((long)pvVar27 + lVar60 + lVar49 * 4);
      auVar98._0_4_ = fVar273 * *pfVar43 + auVar99._0_4_;
      auVar98._4_4_ = fVar274 * pfVar43[1] + auVar99._4_4_;
      auVar98._8_4_ = fVar275 * pfVar43[2] + auVar99._8_4_;
      auVar98._12_4_ = fVar276 * pfVar43[3] + auVar99._12_4_;
      auVar98._16_4_ = fVar100 * pfVar43[4] + auVar99._16_4_;
      auVar98._20_4_ = fVar141 * pfVar43[5] + auVar99._20_4_;
      auVar98._24_4_ = fVar142 * pfVar43[6] + auVar99._24_4_;
      auVar98._28_4_ = pfVar51[7] + auVar99._28_4_;
      auVar99 = ZEXT3264(auVar98);
      iVar42 = iVar42 + 8;
      lVar60 = lVar60 + 0x20;
      in_ZMM7 = ZEXT3264(auVar251._0_32_);
    } while (iVar42 < (int)uVar62);
    lVar50 = lVar60 + lVar49 * 4;
    lVar57 = lVar60 + lVar57 * 4;
    lVar49 = lVar60 + lVar55 * 4;
    pvVar48 = (void *)((long)pvVar48 + lVar60);
    pfVar51 = (float *)((long)local_138 + lVar60);
  }
  lVar49 = (long)pvVar27 + lVar49;
  lVar57 = (long)pvVar27 + lVar57;
  lVar50 = (long)pvVar27 + lVar50;
  auVar221 = ZEXT816(0) << 0x40;
  if ((int)(uVar59 | 3) < (int)uVar62) {
    lVar55 = 0;
    auVar99 = ZEXT864(0);
    uVar58 = uVar59;
    auVar184 = ZEXT816(0);
    auVar227 = auVar221;
    auVar261 = ZEXT816(0);
    do {
      pfVar43 = (float *)((long)pfVar51 + lVar55);
      fVar273 = *pfVar43;
      fVar274 = pfVar43[1];
      fVar275 = pfVar43[2];
      fVar276 = pfVar43[3];
      pfVar43 = (float *)((long)pvVar48 + lVar55);
      auVar221._0_4_ = fVar273 * *pfVar43 + auVar227._0_4_;
      auVar221._4_4_ = fVar274 * pfVar43[1] + auVar227._4_4_;
      auVar221._8_4_ = fVar275 * pfVar43[2] + auVar227._8_4_;
      auVar221._12_4_ = fVar276 * pfVar43[3] + auVar227._12_4_;
      pfVar43 = (float *)(lVar49 + lVar55);
      auVar240._0_4_ = fVar273 * *pfVar43 + auVar99._0_4_;
      auVar240._4_4_ = fVar274 * pfVar43[1] + auVar99._4_4_;
      auVar240._8_4_ = fVar275 * pfVar43[2] + auVar99._8_4_;
      auVar240._12_4_ = fVar276 * pfVar43[3] + auVar99._12_4_;
      auVar99 = ZEXT1664(auVar240);
      pfVar43 = (float *)(lVar57 + lVar55);
      auVar232._0_4_ = fVar273 * *pfVar43 + auVar261._0_4_;
      auVar232._4_4_ = fVar274 * pfVar43[1] + auVar261._4_4_;
      auVar232._8_4_ = fVar275 * pfVar43[2] + auVar261._8_4_;
      auVar232._12_4_ = fVar276 * pfVar43[3] + auVar261._12_4_;
      pfVar43 = (float *)(lVar50 + lVar55);
      auVar215._0_4_ = fVar273 * *pfVar43 + auVar184._0_4_;
      auVar215._4_4_ = fVar274 * pfVar43[1] + auVar184._4_4_;
      auVar215._8_4_ = fVar275 * pfVar43[2] + auVar184._8_4_;
      auVar215._12_4_ = fVar276 * pfVar43[3] + auVar184._12_4_;
      uVar59 = uVar58 + 4;
      iVar42 = uVar58 + 7;
      lVar55 = lVar55 + 0x10;
      uVar58 = uVar59;
      auVar184 = auVar215;
      auVar227 = auVar221;
      auVar261 = auVar232;
    } while (iVar42 < (int)uVar62);
    pfVar51 = (float *)((long)pfVar51 + lVar55);
    lVar50 = lVar50 + lVar55;
    lVar57 = lVar57 + lVar55;
    lVar49 = lVar49 + lVar55;
    pvVar48 = (void *)((long)pvVar48 + lVar55);
  }
  else {
    auVar240 = SUB6416(ZEXT864(0),0);
    auVar232 = ZEXT816(0);
    auVar215 = ZEXT816(0);
  }
  if (uVar62 - uVar59 != 0 && (int)uVar59 <= (int)uVar62) {
    lVar55 = 0;
    do {
      auVar184 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar48 + lVar55 * 4)),
                               ZEXT416(*(uint *)(lVar49 + lVar55 * 4)),0x10);
      auVar184 = vinsertps_avx(auVar184,ZEXT416(*(uint *)(lVar57 + lVar55 * 4)),0x20);
      auVar184 = vinsertps_avx(auVar184,ZEXT416(*(uint *)(lVar50 + lVar55 * 4)),0x30);
      fVar273 = pfVar51[lVar55];
      fVar267 = auVar184._0_4_ * fVar273 + fVar267;
      fVar270 = auVar184._4_4_ * fVar273 + fVar270;
      fVar271 = auVar184._8_4_ * fVar273 + fVar271;
      fVar272 = auVar184._12_4_ * fVar273 + fVar272;
      lVar55 = lVar55 + 1;
    } while (uVar62 - uVar59 != (int)lVar55);
  }
  auVar90 = vhaddps_avx(auVar139,auVar206);
  auVar243 = vhaddps_avx(auVar174,auVar98);
  auVar90 = vhaddps_avx(auVar90,auVar243);
  auVar227 = vunpcklps_avx(auVar221,auVar240);
  auVar261 = vunpcklps_avx(auVar232,auVar215);
  auVar188 = vunpckhps_avx(auVar221,auVar240);
  auVar102 = vunpckhps_avx(auVar232,auVar215);
  auVar184 = vmovlhps_avx(auVar227,auVar261);
  auVar261 = vunpckhpd_avx(auVar227,auVar261);
  auVar227 = vmovlhps_avx(auVar188,auVar102);
  auVar188 = vunpckhpd_avx(auVar188,auVar102);
  auVar65._0_4_ =
       auVar261._0_4_ + auVar184._0_4_ + auVar227._0_4_ + auVar188._0_4_ + auVar90._0_4_ +
       auVar90._16_4_ + fVar267;
  auVar65._4_4_ =
       auVar261._4_4_ + auVar184._4_4_ + auVar227._4_4_ + auVar188._4_4_ + auVar90._4_4_ +
       auVar90._20_4_ + fVar270;
  auVar65._8_4_ =
       auVar261._8_4_ + auVar184._8_4_ + auVar227._8_4_ + auVar188._8_4_ + auVar90._8_4_ +
       auVar90._24_4_ + fVar271;
  auVar65._12_4_ =
       auVar261._12_4_ + auVar184._12_4_ + auVar227._12_4_ + auVar188._12_4_ + auVar90._12_4_ +
       auVar90._28_4_ + fVar272;
  switch(uVar44) {
  case 1:
    auVar41._12_4_ = 0;
    auVar41._0_12_ = ZEXT412(0);
    auVar65 = vmaxps_avx(auVar65,auVar41 << 0x20);
    break;
  case 2:
    auVar184 = vmaxps_avx(auVar65,ZEXT416(0) << 0x20);
    auVar227 = vminps_avx(auVar65,ZEXT416(0) << 0x20);
    fVar267 = **(float **)(&this->field_0xe8 + (long)p_Var24);
    auVar65._0_4_ = fVar267 * auVar227._0_4_ + auVar184._0_4_;
    auVar65._4_4_ = fVar267 * auVar227._4_4_ + auVar184._4_4_;
    auVar65._8_4_ = fVar267 * auVar227._8_4_ + auVar184._8_4_;
    auVar65._12_4_ = fVar267 * auVar227._12_4_ + auVar184._12_4_;
    break;
  case 3:
    uVar13 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var24);
    auVar82._4_4_ = uVar13;
    auVar82._0_4_ = uVar13;
    auVar82._8_4_ = uVar13;
    auVar82._12_4_ = uVar13;
    uVar13 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var24))[1];
    auVar117._4_4_ = uVar13;
    auVar117._0_4_ = uVar13;
    auVar117._8_4_ = uVar13;
    auVar117._12_4_ = uVar13;
    auVar184 = vmaxps_avx(auVar65,auVar82);
    auVar65 = vminps_avx(auVar184,auVar117);
    break;
  case 4:
    uVar52 = CONCAT44(auVar65._4_4_,auVar65._0_4_);
    auVar66._0_8_ = uVar52 ^ 0x8000000080000000;
    auVar66._8_4_ = -auVar65._8_4_;
    auVar66._12_4_ = -auVar65._12_4_;
    auVar83._8_4_ = 0x42b0c0a5;
    auVar83._0_8_ = 0x42b0c0a542b0c0a5;
    auVar83._12_4_ = 0x42b0c0a5;
    auVar184 = vminps_avx(auVar66,auVar83);
    auVar84._8_4_ = 0xc2b0c0a5;
    auVar84._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar84._12_4_ = 0xc2b0c0a5;
    auVar261 = vmaxps_avx(auVar184,auVar84);
    auVar85._0_4_ = auVar261._0_4_ * 1.442695 + 0.5;
    auVar85._4_4_ = auVar261._4_4_ * 1.442695 + 0.5;
    auVar85._8_4_ = auVar261._8_4_ * 1.442695 + 0.5;
    auVar85._12_4_ = auVar261._12_4_ * 1.442695 + 0.5;
    auVar160._0_4_ = (int)auVar85._0_4_;
    auVar160._4_4_ = (int)auVar85._4_4_;
    auVar160._8_4_ = (int)auVar85._8_4_;
    auVar160._12_4_ = (int)auVar85._12_4_;
    auVar227 = vcvtdq2ps_avx(auVar160);
    auVar184 = vcmpps_avx(auVar85,auVar227,1);
    auVar195._8_4_ = 0x3f800000;
    auVar195._0_8_ = 0x3f8000003f800000;
    auVar195._12_4_ = 0x3f800000;
    auVar184 = vandps_avx(auVar184,auVar195);
    auVar184 = vsubps_avx(auVar227,auVar184);
    fVar267 = auVar261._0_4_ + auVar184._0_4_ * -0.6931472;
    fVar270 = auVar261._4_4_ + auVar184._4_4_ * -0.6931472;
    fVar271 = auVar261._8_4_ + auVar184._8_4_ * -0.6931472;
    fVar272 = auVar261._12_4_ + auVar184._12_4_ * -0.6931472;
    auVar86._0_4_ = (int)auVar184._0_4_;
    auVar86._4_4_ = (int)auVar184._4_4_;
    auVar86._8_4_ = (int)auVar184._8_4_;
    auVar86._12_4_ = (int)auVar184._12_4_;
    auVar184 = vpslld_avx(auVar86,0x17);
    auVar184 = vpaddd_avx(auVar184,auVar195);
    auVar67._0_4_ =
         (fVar267 + 1.0 +
         fVar267 * fVar267 *
         (((((fVar267 * 0.00019875691 + 0.0013981999) * fVar267 + 0.008333452) * fVar267 +
           0.041665796) * fVar267 + 0.16666666) * fVar267 + 0.5)) * auVar184._0_4_ + 1.0;
    auVar67._4_4_ =
         (fVar270 + 1.0 +
         fVar270 * fVar270 *
         (((((fVar270 * 0.00019875691 + 0.0013981999) * fVar270 + 0.008333452) * fVar270 +
           0.041665796) * fVar270 + 0.16666666) * fVar270 + 0.5)) * auVar184._4_4_ + 1.0;
    auVar67._8_4_ =
         (fVar271 + 1.0 +
         fVar271 * fVar271 *
         (((((fVar271 * 0.00019875691 + 0.0013981999) * fVar271 + 0.008333452) * fVar271 +
           0.041665796) * fVar271 + 0.16666666) * fVar271 + 0.5)) * auVar184._8_4_ + 1.0;
    auVar67._12_4_ =
         (fVar272 + 1.0 +
         fVar272 * fVar272 *
         (((((fVar272 * 0.00019875691 + 0.0013981999) * fVar272 + 0.008333452) * fVar272 +
           0.041665796) * fVar272 + 0.16666666) * fVar272 + 0.5)) * auVar184._12_4_ + 1.0;
    auVar184 = vrcpps_avx(auVar67);
    fVar267 = auVar184._0_4_;
    auVar68._0_4_ = auVar67._0_4_ * fVar267;
    fVar270 = auVar184._4_4_;
    auVar68._4_4_ = auVar67._4_4_ * fVar270;
    fVar271 = auVar184._8_4_;
    auVar68._8_4_ = auVar67._8_4_ * fVar271;
    fVar272 = auVar184._12_4_;
    auVar68._12_4_ = auVar67._12_4_ * fVar272;
    auVar184 = vsubps_avx(auVar195,auVar68);
    auVar65._0_4_ = fVar267 + fVar267 * auVar184._0_4_;
    auVar65._4_4_ = fVar270 + fVar270 * auVar184._4_4_;
    auVar65._8_4_ = fVar271 + fVar271 * auVar184._8_4_;
    auVar65._12_4_ = fVar272 + fVar272 * auVar184._12_4_;
    break;
  case 5:
    auVar75._8_4_ = 0x42b0c0a5;
    auVar75._0_8_ = 0x42b0c0a542b0c0a5;
    auVar75._12_4_ = 0x42b0c0a5;
    auVar184 = vminps_avx(auVar65,auVar75);
    auVar111._8_4_ = 0xc2b0c0a5;
    auVar111._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar111._12_4_ = 0xc2b0c0a5;
    auVar261 = vmaxps_avx(auVar184,auVar111);
    auVar193._8_4_ = 0x3f000000;
    auVar193._0_8_ = 0x3f0000003f000000;
    auVar193._12_4_ = 0x3f000000;
    auVar76._0_4_ = auVar261._0_4_ * 1.442695 + 0.5;
    auVar76._4_4_ = auVar261._4_4_ * 1.442695 + 0.5;
    auVar76._8_4_ = auVar261._8_4_ * 1.442695 + 0.5;
    auVar76._12_4_ = auVar261._12_4_ * 1.442695 + 0.5;
    auVar222._0_4_ = (int)auVar76._0_4_;
    auVar222._4_4_ = (int)auVar76._4_4_;
    auVar222._8_4_ = (int)auVar76._8_4_;
    auVar222._12_4_ = (int)auVar76._12_4_;
    auVar227 = vcvtdq2ps_avx(auVar222);
    auVar184 = vcmpps_avx(auVar76,auVar227,1);
    auVar159._8_4_ = 0x3f800000;
    auVar159._0_8_ = 0x3f8000003f800000;
    auVar159._12_4_ = 0x3f800000;
    auVar184 = vandps_avx(auVar184,auVar159);
    auVar184 = vsubps_avx(auVar227,auVar184);
    auVar241._0_4_ = auVar184._0_4_ * 0.6931472;
    auVar241._4_4_ = auVar184._4_4_ * 0.6931472;
    auVar241._8_4_ = auVar184._8_4_ * 0.6931472;
    auVar241._12_4_ = auVar184._12_4_ * 0.6931472;
    auVar227 = vsubps_avx(auVar261,auVar241);
    fVar267 = auVar227._0_4_;
    fVar270 = auVar227._4_4_;
    fVar271 = auVar227._8_4_;
    fVar272 = auVar227._12_4_;
    auVar265._0_4_ = (int)auVar184._0_4_;
    auVar265._4_4_ = (int)auVar184._4_4_;
    auVar265._8_4_ = (int)auVar184._8_4_;
    auVar265._12_4_ = (int)auVar184._12_4_;
    auVar184 = vpslld_avx(auVar265,0x17);
    auVar184 = vpaddd_avx(auVar184,auVar159);
    auVar77._0_4_ =
         auVar184._0_4_ *
         (fVar267 + 1.0 +
         fVar267 * fVar267 *
         (fVar267 * ((((fVar267 * 0.00019875691 + 0.0013981999) * fVar267 + 0.008333452) * fVar267 +
                     0.041665796) * fVar267 + 0.16666666) + 0.5)) + 1.0;
    auVar77._4_4_ =
         auVar184._4_4_ *
         (fVar270 + 1.0 +
         fVar270 * fVar270 *
         (fVar270 * ((((fVar270 * 0.00019875691 + 0.0013981999) * fVar270 + 0.008333452) * fVar270 +
                     0.041665796) * fVar270 + 0.16666666) + 0.5)) + 1.0;
    auVar77._8_4_ =
         auVar184._8_4_ *
         (fVar271 + 1.0 +
         fVar271 * fVar271 *
         (fVar271 * ((((fVar271 * 0.00019875691 + 0.0013981999) * fVar271 + 0.008333452) * fVar271 +
                     0.041665796) * fVar271 + 0.16666666) + 0.5)) + 1.0;
    auVar77._12_4_ =
         auVar184._12_4_ *
         (fVar272 + 1.0 +
         fVar272 * fVar272 *
         (fVar272 * ((((fVar272 * 0.00019875691 + 0.0013981999) * fVar272 + 0.008333452) * fVar272 +
                     0.041665796) * fVar272 + 0.16666666) + 0.5)) + 1.0;
    auVar227 = vcmpps_avx(auVar77,ZEXT816(0) << 0x40,2);
    auVar260._8_4_ = 0x800000;
    auVar260._0_8_ = 0x80000000800000;
    auVar260._12_4_ = 0x800000;
    auVar184 = vmaxps_avx(auVar260,auVar77);
    auVar261 = vpsrld_avx(auVar184,0x17);
    auVar268._8_4_ = 0x807fffff;
    auVar268._0_8_ = 0x807fffff807fffff;
    auVar268._12_4_ = 0x807fffff;
    auVar184 = vandps_avx(auVar268,auVar184);
    auVar188 = vorps_avx(auVar184,auVar193);
    auVar269._8_4_ = 0xffffff82;
    auVar269._0_8_ = 0xffffff82ffffff82;
    auVar269._12_4_ = 0xffffff82;
    auVar102 = vpaddd_avx(auVar261,auVar269);
    auVar262._8_4_ = 0x3f3504f3;
    auVar262._0_8_ = 0x3f3504f33f3504f3;
    auVar262._12_4_ = 0x3f3504f3;
    auVar261 = vcmpps_avx(auVar188,auVar262,1);
    auVar184 = vandps_avx(auVar261,auVar188);
    auVar263._8_4_ = 0xbf800000;
    auVar263._0_8_ = 0xbf800000bf800000;
    auVar263._12_4_ = 0xbf800000;
    fVar267 = auVar184._0_4_ + auVar188._0_4_ + -1.0;
    fVar270 = auVar184._4_4_ + auVar188._4_4_ + -1.0;
    fVar271 = auVar184._8_4_ + auVar188._8_4_ + -1.0;
    fVar272 = auVar184._12_4_ + auVar188._12_4_ + -1.0;
    auVar188 = vcvtdq2ps_avx(auVar102);
    auVar184 = vandps_avx(auVar261,auVar159);
    auVar184 = vsubps_avx(auVar188,auVar184);
    auVar78._0_4_ =
         (fVar267 + auVar184._0_4_ * 0.6931472 +
         fVar267 * fVar267 *
         (fVar267 * (fVar267 * (fVar267 * (fVar267 * (fVar267 * (fVar267 * (fVar267 * (fVar267 * (
                                                  fVar267 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                          0.20000714) + -0.24999994) + 0.3333333) + -0.5)) * -2.0;
    auVar78._4_4_ =
         (fVar270 + auVar184._4_4_ * 0.6931472 +
         fVar270 * fVar270 *
         (fVar270 * (fVar270 * (fVar270 * (fVar270 * (fVar270 * (fVar270 * (fVar270 * (fVar270 * (
                                                  fVar270 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                          0.20000714) + -0.24999994) + 0.3333333) + -0.5)) * -2.0;
    auVar78._8_4_ =
         (fVar271 + auVar184._8_4_ * 0.6931472 +
         fVar271 * fVar271 *
         (fVar271 * (fVar271 * (fVar271 * (fVar271 * (fVar271 * (fVar271 * (fVar271 * (fVar271 * (
                                                  fVar271 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                          0.20000714) + -0.24999994) + 0.3333333) + -0.5)) * -2.0;
    auVar78._12_4_ =
         (fVar272 + auVar184._12_4_ * 0.6931472 +
         fVar272 * fVar272 *
         (fVar272 * (fVar272 * (fVar272 * (fVar272 * (fVar272 * (fVar272 * (fVar272 * (fVar272 * (
                                                  fVar272 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                          0.20000714) + -0.24999994) + 0.3333333) + -0.5)) * -2.0;
    auVar112._8_4_ = 0x7fffffff;
    auVar112._0_8_ = 0x7fffffff7fffffff;
    auVar112._12_4_ = 0x7fffffff;
    auVar184 = vblendvps_avx(auVar78,auVar112,auVar227);
    auVar113._8_4_ = 0x42b0c0a5;
    auVar113._0_8_ = 0x42b0c0a542b0c0a5;
    auVar113._12_4_ = 0x42b0c0a5;
    auVar184 = vminps_avx(auVar184,auVar113);
    auVar114._8_4_ = 0xc2b0c0a5;
    auVar114._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar114._12_4_ = 0xc2b0c0a5;
    auVar261 = vmaxps_avx(auVar184,auVar114);
    auVar115._0_4_ = auVar261._0_4_ * 1.442695 + 0.5;
    auVar115._4_4_ = auVar261._4_4_ * 1.442695 + 0.5;
    auVar115._8_4_ = auVar261._8_4_ * 1.442695 + 0.5;
    auVar115._12_4_ = auVar261._12_4_ * 1.442695 + 0.5;
    auVar216._0_4_ = (int)auVar115._0_4_;
    auVar216._4_4_ = (int)auVar115._4_4_;
    auVar216._8_4_ = (int)auVar115._8_4_;
    auVar216._12_4_ = (int)auVar115._12_4_;
    auVar227 = vcvtdq2ps_avx(auVar216);
    auVar184 = vcmpps_avx(auVar115,auVar227,1);
    auVar184 = vandps_avx(auVar184,auVar159);
    auVar184 = vsubps_avx(auVar227,auVar184);
    auVar217._0_4_ = auVar184._0_4_ * 0.6931472;
    auVar217._4_4_ = auVar184._4_4_ * 0.6931472;
    auVar217._8_4_ = auVar184._8_4_ * 0.6931472;
    auVar217._12_4_ = auVar184._12_4_ * 0.6931472;
    auVar227 = vsubps_avx(auVar261,auVar217);
    fVar267 = auVar227._0_4_;
    fVar270 = auVar227._4_4_;
    fVar271 = auVar227._8_4_;
    fVar272 = auVar227._12_4_;
    auVar116._0_4_ = (int)auVar184._0_4_;
    auVar116._4_4_ = (int)auVar184._4_4_;
    auVar116._8_4_ = (int)auVar184._8_4_;
    auVar116._12_4_ = (int)auVar184._12_4_;
    auVar184 = vpslld_avx(auVar116,0x17);
    auVar184 = vpaddd_avx(auVar184,auVar159);
    auVar79._0_4_ =
         (fVar267 + 1.0 +
         fVar267 * fVar267 *
         (((((fVar267 * 0.00019875691 + 0.0013981999) * fVar267 + 0.008333452) * fVar267 +
           0.041665796) * fVar267 + 0.16666666) * fVar267 + 0.5)) * auVar184._0_4_ + 1.0;
    auVar79._4_4_ =
         (fVar270 + 1.0 +
         fVar270 * fVar270 *
         (((((fVar270 * 0.00019875691 + 0.0013981999) * fVar270 + 0.008333452) * fVar270 +
           0.041665796) * fVar270 + 0.16666666) * fVar270 + 0.5)) * auVar184._4_4_ + 1.0;
    auVar79._8_4_ =
         (fVar271 + 1.0 +
         fVar271 * fVar271 *
         (((((fVar271 * 0.00019875691 + 0.0013981999) * fVar271 + 0.008333452) * fVar271 +
           0.041665796) * fVar271 + 0.16666666) * fVar271 + 0.5)) * auVar184._8_4_ + 1.0;
    auVar79._12_4_ =
         (fVar272 + 1.0 +
         fVar272 * fVar272 *
         (((((fVar272 * 0.00019875691 + 0.0013981999) * fVar272 + 0.008333452) * fVar272 +
           0.041665796) * fVar272 + 0.16666666) * fVar272 + 0.5)) * auVar184._12_4_ + 1.0;
    auVar184 = vrcpps_avx(auVar79);
    fVar267 = auVar184._0_4_;
    fVar270 = auVar184._4_4_;
    fVar271 = auVar184._8_4_;
    fVar272 = auVar184._12_4_;
    auVar80._0_4_ = auVar79._0_4_ * (fVar267 + fVar267);
    auVar80._4_4_ = auVar79._4_4_ * (fVar270 + fVar270);
    auVar80._8_4_ = auVar79._8_4_ * (fVar271 + fVar271);
    auVar80._12_4_ = auVar79._12_4_ * (fVar272 + fVar272);
    auVar194._8_4_ = 0x40000000;
    auVar194._0_8_ = 0x4000000040000000;
    auVar194._12_4_ = 0x40000000;
    auVar184 = vsubps_avx(auVar194,auVar80);
    auVar81._0_4_ = fVar267 + fVar267 + -1.0 + fVar267 * auVar184._0_4_;
    auVar81._4_4_ = fVar270 + fVar270 + -1.0 + fVar270 * auVar184._4_4_;
    auVar81._8_4_ = fVar271 + fVar271 + -1.0 + fVar271 * auVar184._8_4_;
    auVar81._12_4_ = fVar272 + fVar272 + -1.0 + fVar272 * auVar184._12_4_;
    goto LAB_00300404;
  case 6:
    fVar267 = **(float **)(&this->field_0xe8 + (long)p_Var24);
    fVar270 = (*(float **)(&this->field_0xe8 + (long)p_Var24))[1];
    auVar87._0_4_ = fVar267 * auVar65._0_4_ + fVar270;
    auVar87._4_4_ = fVar267 * auVar65._4_4_ + fVar270;
    auVar87._8_4_ = fVar267 * auVar65._8_4_ + fVar270;
    auVar87._12_4_ = fVar267 * auVar65._12_4_ + fVar270;
    auVar184 = vmaxps_avx(auVar87,ZEXT416(0) << 0x20);
    auVar118._8_4_ = 0x3f800000;
    auVar118._0_8_ = 0x3f8000003f800000;
    auVar118._12_4_ = 0x3f800000;
    auVar81 = vminps_avx(auVar184,auVar118);
LAB_00300404:
    auVar65._0_4_ = auVar81._0_4_ * auVar65._0_4_;
    auVar65._4_4_ = auVar81._4_4_ * auVar65._4_4_;
    auVar65._8_4_ = auVar81._8_4_ * auVar65._8_4_;
    auVar65._12_4_ = auVar81._12_4_ * auVar65._12_4_;
  }
  *(undefined1 (*) [16])((long)top_blob->data + uVar45 * 4) = auVar65;
LAB_0030041c:
  iVar42 = (int)uVar45 + (uVar47 >> 2 & 1) * 4;
  if (iVar42 < (int)uVar47) {
    pvVar48 = (this->weight_data_tm).data;
    pfVar51 = *(float **)(&this->field_0xe8 + (long)p_Var24);
    pvVar27 = top_blob->data;
    local_148 = uVar62 & 0xfffffff8;
    uVar45 = (ulong)iVar42;
    auVar226 = ZEXT3264(_DAT_00596440);
    auVar237 = ZEXT3264(_DAT_00596460);
    local_e8._8_8_ = 0x8000000000000000;
    local_e8._0_8_ = 0x8000000000000000;
    auVar245 = ZEXT1664(local_e8);
    auVar184 = vpcmpeqd_avx(auVar263,auVar263);
    auVar99 = ZEXT1664(auVar184);
    do {
      auVar184 = ZEXT816(0) << 0x40;
      if (lVar26 != 0) {
        auVar184 = ZEXT416(*(uint *)(lVar26 + uVar45 * 4));
      }
      pfVar43 = (float *)(uVar45 * lVar56 * 4 + (long)pvVar48);
      pfVar46 = pfVar54;
      if ((int)uVar62 < 8) {
        fVar267 = 0.0;
        fVar270 = 0.0;
        fVar271 = 0.0;
        fVar272 = 0.0;
        fVar273 = 0.0;
        fVar274 = 0.0;
        fVar275 = 0.0;
        fVar276 = 0.0;
        uVar47 = 0;
      }
      else {
        fVar267 = 0.0;
        fVar270 = 0.0;
        fVar271 = 0.0;
        fVar272 = 0.0;
        fVar273 = 0.0;
        fVar274 = 0.0;
        fVar275 = 0.0;
        fVar276 = 0.0;
        iVar42 = 7;
        do {
          fVar267 = *pfVar43 * *pfVar46 + fVar267;
          fVar270 = pfVar43[1] * pfVar46[1] + fVar270;
          fVar271 = pfVar43[2] * pfVar46[2] + fVar271;
          fVar272 = pfVar43[3] * pfVar46[3] + fVar272;
          fVar273 = pfVar43[4] * pfVar46[4] + fVar273;
          fVar274 = pfVar43[5] * pfVar46[5] + fVar274;
          fVar275 = pfVar43[6] * pfVar46[6] + fVar275;
          fVar276 = pfVar43[7] + fVar276;
          pfVar46 = pfVar46 + 8;
          pfVar43 = pfVar43 + 8;
          iVar42 = iVar42 + 8;
          uVar47 = local_148;
        } while (iVar42 < (int)uVar62);
      }
      fVar100 = 0.0;
      fVar141 = 0.0;
      fVar142 = 0.0;
      fVar143 = 0.0;
      uVar59 = uVar47 | 3;
      while ((int)uVar59 < (int)uVar62) {
        fVar100 = *pfVar43 * *pfVar46 + fVar100;
        fVar141 = pfVar43[1] * pfVar46[1] + fVar141;
        fVar142 = pfVar43[2] * pfVar46[2] + fVar142;
        fVar143 = pfVar43[3] * pfVar46[3] + fVar143;
        pfVar46 = pfVar46 + 4;
        pfVar43 = pfVar43 + 4;
        uVar59 = uVar47 + 7;
        uVar47 = uVar47 + 4;
      }
      auVar227 = auVar245._0_16_;
      if ((int)uVar47 < (int)uVar62) {
        uVar52 = CONCAT44(0,~uVar47 + uVar62);
        auVar184 = vblendps_avx(auVar184,_DAT_005930d0,0xe);
        auVar161._8_8_ = 0;
        auVar161._0_8_ = uVar52;
        auVar102 = vpshufd_avx(auVar161,0x44);
        auVar261 = vorps_avx(auVar227,auVar102);
        auVar188 = vorps_avx(auVar227,auVar102);
        uVar53 = 0;
        auVar251 = ZEXT1664(auVar184);
        do {
          auVar238 = auVar251;
          auVar218._8_8_ = 0;
          auVar218._0_8_ = uVar53;
          auVar184 = vpshufd_avx(auVar218,0x44);
          auVar236._16_16_ = auVar184;
          auVar236._0_16_ = auVar184;
          auVar90 = vorps_avx(auVar226._0_32_,auVar236);
          auVar243 = vorps_avx(auVar237._0_32_,auVar236);
          auVar184 = vorps_avx(auVar102,auVar227);
          uVar47 = auVar245._0_4_;
          auVar242._0_4_ = auVar243._16_4_ ^ uVar47;
          uVar59 = auVar245._4_4_;
          auVar242._4_4_ = auVar243._20_4_ ^ uVar59;
          uVar58 = auVar245._8_4_;
          auVar242._8_4_ = auVar243._24_4_ ^ uVar58;
          uVar31 = auVar245._12_4_;
          auVar242._12_4_ = auVar243._28_4_ ^ uVar31;
          auVar101 = vpcmpgtq_avx(auVar242,auVar184);
          auVar254._0_4_ = uVar47 ^ auVar243._0_4_;
          auVar254._4_4_ = uVar59 ^ auVar243._4_4_;
          auVar254._8_4_ = uVar58 ^ auVar243._8_4_;
          auVar254._12_4_ = uVar31 ^ auVar243._12_4_;
          auVar150 = vpcmpgtq_avx(auVar254,auVar261);
          auVar150 = vpackssdw_avx(auVar150,auVar101);
          auVar256._0_4_ = auVar90._16_4_ ^ uVar47;
          auVar256._4_4_ = auVar90._20_4_ ^ uVar59;
          auVar256._8_4_ = auVar90._24_4_ ^ uVar58;
          auVar256._12_4_ = auVar90._28_4_ ^ uVar31;
          auVar151 = vpcmpgtq_avx(auVar256,auVar184);
          auVar257._0_4_ = uVar47 ^ auVar90._0_4_;
          auVar257._4_4_ = uVar59 ^ auVar90._4_4_;
          auVar257._8_4_ = uVar58 ^ auVar90._8_4_;
          auVar257._12_4_ = uVar31 ^ auVar90._12_4_;
          auVar184 = vpcmpgtq_avx(auVar257,auVar188);
          auVar184 = vpackssdw_avx(auVar184,auVar151);
          auVar184 = vpackssdw_avx(auVar184 ^ auVar99._0_16_,auVar150 ^ auVar99._0_16_);
          auVar150 = vpmovsxwd_avx(auVar184);
          auVar184 = vpunpckhwd_avx(auVar184,auVar184);
          auVar259._16_16_ = auVar184;
          auVar259._0_16_ = auVar150;
          auVar248 = vmaskmovps_avx(auVar259,*(undefined1 (*) [32])(pfVar46 + uVar53));
          auVar122 = vmaskmovps_avx(auVar259,*(undefined1 (*) [32])(pfVar43 + uVar53));
          auVar184 = vpcmpeqd_avx(auVar248._0_16_,auVar248._0_16_);
          auVar99 = ZEXT1664(auVar184);
          auVar119._0_4_ = auVar238._0_4_ + auVar248._0_4_ * auVar122._0_4_;
          auVar119._4_4_ = auVar238._4_4_ + auVar248._4_4_ * auVar122._4_4_;
          auVar119._8_4_ = auVar238._8_4_ + auVar248._8_4_ * auVar122._8_4_;
          auVar119._12_4_ = auVar238._12_4_ + auVar248._12_4_ * auVar122._12_4_;
          auVar140._16_4_ = auVar238._16_4_ + auVar248._16_4_ * auVar122._16_4_;
          auVar140._0_16_ = auVar119;
          auVar140._20_4_ = auVar238._20_4_ + auVar248._20_4_ * auVar122._20_4_;
          auVar140._24_4_ = auVar238._24_4_ + auVar248._24_4_ * auVar122._24_4_;
          auVar140._28_4_ = auVar238._28_4_ + auVar122._28_4_;
          uVar53 = uVar53 + 8;
          auVar251 = ZEXT3264(auVar140);
        } while ((uVar52 + 8 & 0xfffffffffffffff8) != uVar53);
        auVar261 = vorps_avx(auVar227,auVar102);
        auVar223._0_4_ = uVar47 ^ auVar243._0_4_;
        auVar223._4_4_ = uVar59 ^ auVar243._4_4_;
        auVar223._8_4_ = uVar58 ^ auVar243._8_4_;
        auVar223._12_4_ = uVar31 ^ auVar243._12_4_;
        auVar261 = vpcmpgtq_avx(auVar223,auVar261);
        auVar261 = vpackssdw_avx(auVar261,auVar101);
        auVar227 = vorps_avx(auVar227,auVar102);
        auVar219._0_4_ = uVar47 ^ auVar90._0_4_;
        auVar219._4_4_ = uVar59 ^ auVar90._4_4_;
        auVar219._8_4_ = uVar58 ^ auVar90._8_4_;
        auVar219._12_4_ = uVar31 ^ auVar90._12_4_;
        auVar227 = vpcmpgtq_avx(auVar219,auVar227);
        auVar227 = vpackssdw_avx(auVar227,auVar151);
        auVar227 = vblendvps_avx(auVar238._0_16_,auVar119,auVar184 ^ auVar227);
        auVar184 = vblendvps_avx(auVar238._16_16_,auVar140._16_16_,auVar184 ^ auVar261);
        auVar184 = vhaddps_avx(auVar184,auVar227);
        auVar184 = vhaddps_avx(auVar184,auVar184);
        auVar184 = vhaddps_avx(auVar184,auVar184);
      }
      auVar69._0_4_ = fVar267 + fVar273 + fVar100;
      auVar69._4_4_ = fVar270 + fVar274 + fVar141;
      auVar69._8_4_ = fVar271 + fVar275 + fVar142;
      auVar69._12_4_ = fVar272 + fVar276 + fVar143;
      auVar227 = vhaddps_avx(auVar69,auVar69);
      auVar227 = vhaddps_avx(auVar227,auVar227);
      fVar267 = auVar227._0_4_ + auVar184._0_4_;
      auVar184 = ZEXT416((uint)fVar267);
      auVar227 = auVar99._0_16_;
      fVar270 = fVar267;
      switch(uVar44) {
      case 1:
        auVar184 = vmaxss_avx(auVar184,ZEXT416(0));
        fVar270 = auVar184._0_4_;
        break;
      case 2:
        auVar184 = vcmpss_avx(ZEXT816(0) << 0x20,auVar184,1);
        auVar121._8_4_ = 0x3f800000;
        auVar121._0_8_ = 0x3f8000003f800000;
        auVar121._12_4_ = 0x3f800000;
        auVar184 = vblendvps_avx(ZEXT416((uint)*pfVar51),auVar121,auVar184);
        fVar270 = auVar184._0_4_;
LAB_0030079a:
        fVar270 = fVar270 * fVar267;
        break;
      case 3:
        auVar184 = vmaxss_avx(auVar184,ZEXT416((uint)*pfVar51));
        fVar270 = auVar184._0_4_;
        if (pfVar51[1] < auVar184._0_4_) {
          fVar270 = pfVar51[1];
        }
        break;
      case 4:
        auVar184 = vminss_avx(auVar184,ZEXT416(0x42b0c0a5));
        auVar88._0_8_ = auVar184._0_8_ ^ 0x8000000080000000;
        auVar88._8_4_ = auVar184._8_4_ ^ 0x80000000;
        auVar88._12_4_ = auVar184._12_4_ ^ 0x80000000;
        auVar184 = vcmpss_avx(auVar184,ZEXT416(0xc2b0c0a5),1);
        auVar120._8_4_ = 0x42b0c0a5;
        auVar120._0_8_ = 0x42b0c0a542b0c0a5;
        auVar120._12_4_ = 0x42b0c0a5;
        auVar184 = vblendvps_avx(auVar88,auVar120,auVar184);
        fVar267 = expf(auVar184._0_4_);
        auVar184 = vpcmpeqd_avx(auVar227,auVar227);
        auVar99 = ZEXT1664(auVar184);
        auVar245 = ZEXT1664(local_e8);
        auVar237 = ZEXT3264(_DAT_00596460);
        auVar226 = ZEXT3264(_DAT_00596440);
        fVar270 = 1.0 / (fVar267 + 1.0);
        break;
      case 5:
        fVar270 = expf(fVar267);
        fVar270 = logf(fVar270 + 1.0);
        fVar270 = tanhf(fVar270);
        auVar184 = vpcmpeqd_avx(auVar227,auVar227);
        auVar99 = ZEXT1664(auVar184);
        auVar245 = ZEXT1664(local_e8);
        auVar237 = ZEXT3264(_DAT_00596460);
        auVar226 = ZEXT3264(_DAT_00596440);
        fVar270 = fVar270 * fVar267;
        break;
      case 6:
        fVar271 = *pfVar51;
        fVar272 = -pfVar51[1] / fVar271;
        fVar270 = 0.0;
        if ((fVar272 <= fVar267) && (fVar270 = fVar267, fVar267 <= fVar272 + 1.0 / fVar271)) {
          fVar270 = fVar271 * fVar267 + pfVar51[1];
          goto LAB_0030079a;
        }
      }
      *(float *)((long)pvVar27 + uVar45 * 4) = fVar270;
      uVar45 = uVar45 + 1;
    } while (uVar45 != local_d0);
    local_164 = 0;
  }
LAB_0030080e:
  piVar25 = (int *)CONCAT44(uStack_12c,uStack_130);
  if (piVar25 != (int *)0x0) {
    LOCK();
    *piVar25 = *piVar25 + -1;
    UNLOCK();
    if (*piVar25 == 0) {
      if (local_118 == (Allocator *)0x0) {
        if (local_138 != (float *)0x0) {
          free(local_138);
        }
      }
      else {
        (*local_118->_vptr_Allocator[3])();
      }
    }
  }
  return local_164;
}

Assistant:

int InnerProduct_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}